

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImBitVector *this;
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  stbtt__point sVar5;
  stbtt__point sVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  byte bVar10;
  byte bVar11;
  ImWchar IVar12;
  uint uVar13;
  ImFontConfig *pIVar14;
  ImFont *pIVar15;
  ImFontAtlas *pIVar16;
  ImFont **ppIVar17;
  char *pcVar18;
  stbtt_uint8 *data;
  undefined8 *puVar19;
  ImFontConfig *pIVar20;
  long lVar21;
  char cVar22;
  char cVar28;
  stbrp_node *psVar36;
  short sVar37;
  undefined1 auVar38 [15];
  undefined1 auVar39 [14];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [14];
  undefined1 auVar44 [16];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  stbtt__buf fontdict;
  undefined1 auVar48 [15];
  unkuint9 Var49;
  undefined1 auVar50 [11];
  undefined1 auVar51 [13];
  undefined1 auVar52 [14];
  undefined1 auVar53 [12];
  undefined1 auVar54 [16];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  unkbyte10 Var57;
  uint6 uVar58;
  undefined1 auVar59 [14];
  undefined1 auVar60 [16];
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  bool bVar63;
  ushort uVar64;
  short sVar65;
  stbtt_uint32 sVar66;
  int iVar72;
  stbtt__active_edge *z;
  stbtt_uint32 sVar67;
  stbtt_uint32 sVar68;
  stbtt_uint32 sVar69;
  stbtt_uint32 sVar70;
  ulong uVar73;
  undefined4 extraout_var;
  stbtt_uint32 sVar71;
  ImWchar *pIVar74;
  long lVar75;
  void *pvVar76;
  void *pvVar77;
  stbrp_context *ptr;
  uchar *puVar78;
  stbtt__point *points;
  stbtt__edge *psVar79;
  stbtt__buf *scanline;
  stbtt__buf *psVar80;
  undefined8 *puVar81;
  int iVar82;
  long lVar83;
  uint *puVar84;
  ulong uVar85;
  long lVar86;
  ulong uVar87;
  int *piVar88;
  stbtt__active_edge *psVar89;
  size_t sVar90;
  uint uVar91;
  int iVar92;
  stbtt_fontinfo *psVar93;
  byte *pbVar94;
  uchar uVar95;
  ulong uVar96;
  stbtt__edge *psVar97;
  byte *pbVar98;
  size_t size;
  int iVar99;
  ushort *puVar100;
  ImU32 bit_n;
  uint uVar101;
  long lVar102;
  int iVar103;
  stbtt__active_edge *psVar104;
  int x;
  uint uVar105;
  long lVar106;
  stbtt__active_edge *psVar107;
  stbtt__active_edge *psVar108;
  bool bVar109;
  byte bVar110;
  short sVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  byte bVar116;
  char cVar117;
  char cVar120;
  ushort uVar118;
  short sVar119;
  short sVar121;
  short sVar122;
  short sVar123;
  undefined1 auVar115 [16];
  float fVar124;
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar132;
  undefined1 in_XMM3 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  uint uVar143;
  uint uVar144;
  float fVar145;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar146;
  undefined4 uVar147;
  uint uVar155;
  uint uVar157;
  undefined1 auVar152 [16];
  float fVar156;
  float fVar158;
  uint uVar159;
  float fVar160;
  undefined1 auVar153 [16];
  float fVar161;
  uint uVar166;
  uint uVar168;
  undefined1 auVar162 [16];
  float fVar167;
  float fVar169;
  uint uVar170;
  float fVar171;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined4 uVar172;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  stbtt__buf sVar188;
  float y0_2;
  int y1;
  float x0_2;
  ImVector<stbrp_rect> buf_rects;
  stbtt_uint32 charstrings;
  ImVector<stbtt_packedchar> buf_packedchars;
  stbtt_uint32 fdarrayoff;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  stbtt__buf b;
  undefined4 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0c [12];
  bool local_4d9;
  undefined8 in_stack_fffffffffffffb30;
  uint uVar189;
  void *local_4b8;
  undefined1 local_498 [16];
  stbtt_uint32 local_47c;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  void *local_448;
  long local_440;
  int local_434;
  void *local_430;
  undefined8 local_428;
  void *pvStack_420;
  stbrp_node *local_418;
  ulong local_410;
  undefined8 local_408;
  float local_400;
  uint local_3fc;
  undefined1 local_3f8 [16];
  ulong local_3e0;
  long local_3d8;
  undefined8 *local_3d0;
  ulong local_3c8;
  int local_3c0;
  float local_3bc;
  undefined1 local_3b8 [16];
  stbtt_fontinfo *local_3a8;
  ulong local_3a0;
  uchar *local_398;
  stbtt__point *local_390;
  uchar *local_388;
  ulong local_380;
  uint local_374;
  uint local_370;
  int local_36c;
  float local_368;
  int local_364;
  int local_360;
  int local_35c;
  stbrp_context *local_358;
  float *local_350;
  ulong local_348;
  ulong local_340;
  float *local_338;
  stbtt__edge *local_330;
  undefined1 local_328 [16];
  size_t local_310;
  ImFontConfig *local_308;
  long local_300;
  long local_2f8;
  undefined4 *local_2f0;
  long local_2e8;
  long local_2e0;
  size_t local_2d8;
  size_t local_2d0;
  ulong local_2c8;
  int local_2c0;
  int local_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  ulong local_298;
  undefined8 uStack_290;
  stbtt__buf local_288 [33];
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  undefined6 uVar148;
  undefined8 uVar149;
  undefined1 auVar150 [12];
  undefined1 auVar151 [14];
  undefined1 auVar154 [16];
  undefined6 uVar173;
  undefined8 uVar174;
  undefined1 auVar175 [12];
  undefined1 auVar176 [14];
  undefined1 auVar181 [16];
  
  local_3f8._8_8_ = local_3f8._0_8_;
  if ((atlas->ConfigData).Size < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x829,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s");
  }
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  local_4b8 = (void *)0x0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  uVar13 = (atlas->ConfigData).Size;
  lVar83 = (long)(int)uVar13;
  if (0 < lVar83) {
    uVar73 = 8;
    if (8 < (int)uVar13) {
      uVar73 = (ulong)uVar13;
    }
    local_4b8 = ImGui::MemAlloc(uVar73 * 0x110);
  }
  uVar91 = (atlas->Fonts).Size;
  if ((long)(int)uVar91 < 1) {
    local_430 = (void *)0x0;
  }
  else {
    uVar73 = 8;
    if (8 < (int)uVar91) {
      uVar73 = (ulong)uVar91;
    }
    local_430 = ImGui::MemAlloc(uVar73 << 5);
  }
  local_310 = lVar83 * 0x110;
  uVar189 = 0;
  iVar72 = 0;
  memset(local_4b8,0,local_310);
  local_3f8._0_8_ = (long)(int)uVar91 << 5;
  memset(local_430,0,local_3f8._0_8_);
  iVar103 = (atlas->ConfigData).Size;
  local_4d9 = iVar103 < 1;
  if (0 < iVar103) {
    lVar106 = 0;
    do {
      if (lVar83 <= lVar106) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
      }
      local_498._0_8_ = lVar106;
      if ((atlas->ConfigData).Size <= lVar106) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
      }
      pIVar14 = (atlas->ConfigData).Data;
      pIVar15 = pIVar14[lVar106].DstFont;
      if ((pIVar15 == (ImFont *)0x0) ||
         (pIVar16 = pIVar15->ContainerAtlas, pIVar16 != atlas && pIVar16 != (ImFontAtlas *)0x0)) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                    ,0x841,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s");
      }
      pIVar14 = pIVar14 + lVar106;
      *(undefined4 *)((long)local_4b8 + lVar106 * 0x110 + 0xe0) = 0xffffffff;
      uVar73 = (ulong)(atlas->Fonts).Size;
      if ((long)uVar73 < 1) {
LAB_001cc555:
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                    ,0x848,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s");
      }
      else {
        pIVar15 = pIVar14->DstFont;
        ppIVar17 = (atlas->Fonts).Data;
        iVar103 = *(int *)((long)local_4b8 + lVar106 * 0x110 + 0xe0);
        uVar96 = 0;
        do {
          if (pIVar15 == ppIVar17[uVar96]) {
            iVar103 = (int)uVar96;
            *(int *)((long)local_4b8 + lVar106 * 0x110 + 0xe0) = iVar103;
          }
          uVar96 = uVar96 + 1;
        } while ((uVar96 < uVar73) && (iVar103 == -1));
        if (iVar103 == -1) goto LAB_001cc555;
      }
      if (*(int *)((long)local_4b8 + lVar106 * 0x110 + 0xe0) == -1) goto LAB_001cfc30;
      pcVar18 = (char *)pIVar14->FontData;
      iVar103 = pIVar14->FontNo;
      cVar117 = *pcVar18;
      if (((((cVar117 == '1') && (pcVar18[1] == '\0')) && (pcVar18[2] == '\0')) &&
          (pcVar18[3] == '\0')) ||
         (((cVar117 == 't' && (pcVar18[1] == 'y')) && ((pcVar18[2] == 'p' && (pcVar18[3] == '1')))))
         ) {
LAB_001cc61b:
        uVar189 = -(uint)(iVar103 != 0);
      }
      else {
        if (cVar117 == '\0') {
          if (((pcVar18[1] != '\x01') || (pcVar18[2] != '\0')) || (pcVar18[3] != '\0'))
          goto LAB_001cc5f4;
          goto LAB_001cc61b;
        }
        if ((((cVar117 == 'O') && (pcVar18[1] == 'T')) && (pcVar18[2] == 'T')) &&
           (pcVar18[3] == 'O')) goto LAB_001cc61b;
LAB_001cc5f4:
        uVar189 = 0xffffffff;
        if (cVar117 == 't') {
          if (pcVar18[1] == 't') {
            if ((pcVar18[2] == 'c') && (pcVar18[3] == 'f')) {
              uVar105 = *(uint *)(pcVar18 + 4);
              uVar105 = uVar105 >> 0x18 | (uVar105 & 0xff0000) >> 8 | (uVar105 & 0xff00) << 8 |
                        uVar105 << 0x18;
              if (((uVar105 == 0x20000) || (uVar105 == 0x10000)) &&
                 (uVar105 = *(uint *)(pcVar18 + 8),
                 iVar103 < (int)(uVar105 >> 0x18 | (uVar105 & 0xff0000) >> 8 |
                                 (uVar105 & 0xff00) << 8 | uVar105 << 0x18))) {
                uVar189 = *(uint *)(pcVar18 + (long)iVar103 * 4 + 0xc);
                uVar189 = uVar189 >> 0x18 | (uVar189 & 0xff0000) >> 8 | (uVar189 & 0xff00) << 8 |
                          uVar189 << 0x18;
              }
            }
          }
          else if (((pcVar18[1] == 'r') && (pcVar18[2] == 'u')) && (pcVar18[3] == 'e'))
          goto LAB_001cc61b;
        }
      }
      if ((int)uVar189 < 0) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                    ,0x84e,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s");
      }
      data = (stbtt_uint8 *)pIVar14->FontData;
      *(stbtt_uint8 **)((long)local_4b8 + lVar106 * 0x110 + 8) = data;
      *(uint *)((long)local_4b8 + lVar106 * 0x110 + 0x10) = uVar189;
      *(undefined8 *)((long)local_4b8 + lVar106 * 0x110 + 0x40) = 0;
      *(undefined8 *)((long)local_4b8 + lVar106 * 0x110 + 0x48) = 0;
      sVar71 = uVar189;
      sVar66 = stbtt__find_table(data,uVar189,"cmap");
      auVar126 = local_478;
      local_478._4_4_ = extraout_var;
      local_478._0_4_ = sVar66;
      local_478._8_8_ = auVar126._8_8_;
      sVar66 = stbtt__find_table(data,uVar189,"loca");
      *(stbtt_uint32 *)((long)local_4b8 + lVar106 * 0x110 + 0x18) = sVar66;
      sVar67 = stbtt__find_table(data,uVar189,"head");
      *(stbtt_uint32 *)((long)local_4b8 + lVar106 * 0x110 + 0x1c) = sVar67;
      sVar68 = stbtt__find_table(data,uVar189,"glyf");
      local_3b8._0_4_ = sVar68;
      *(stbtt_uint32 *)((long)local_4b8 + lVar106 * 0x110 + 0x20) = sVar68;
      sVar68 = stbtt__find_table(data,uVar189,"hhea");
      *(stbtt_uint32 *)((long)local_4b8 + lVar106 * 0x110 + 0x24) = sVar68;
      sVar69 = stbtt__find_table(data,uVar189,"hmtx");
      *(stbtt_uint32 *)((long)local_4b8 + lVar106 * 0x110 + 0x28) = sVar69;
      sVar70 = stbtt__find_table(data,uVar189,"kern");
      *(stbtt_uint32 *)((long)local_4b8 + lVar106 * 0x110 + 0x2c) = sVar70;
      sVar70 = stbtt__find_table(data,uVar189,"GPOS");
      *(stbtt_uint32 *)((long)local_4b8 + lVar106 * 0x110 + 0x30) = sVar70;
      if ((((local_478._0_4_ == 0) || (sVar67 == 0)) || (sVar68 == 0)) || (sVar69 == 0))
      goto LAB_001cfc30;
      if (local_3b8._0_4_ == 0) {
        local_428 = CONCAT44(local_428._4_4_,2);
        local_458._0_8_ = local_458._0_8_ & 0xffffffff00000000;
        local_408._0_4_ = 0;
        local_47c = 0;
        sVar66 = stbtt__find_table(data,sVar71,"CFF ");
        if (sVar66 == 0) goto LAB_001cfc30;
        *(undefined8 *)((long)local_4b8 + lVar106 * 0x110 + 0x90) = 0;
        *(undefined8 *)((long)local_4b8 + lVar106 * 0x110 + 0x98) = 0;
        *(undefined8 *)((long)local_4b8 + lVar106 * 0x110 + 0x80) = 0;
        *(undefined8 *)((long)local_4b8 + lVar106 * 0x110 + 0x88) = 0;
        *(stbtt_uint8 **)((long)local_4b8 + lVar106 * 0x110 + 0x40) = data + sVar66;
        *(undefined8 *)((long)local_4b8 + lVar106 * 0x110 + 0x48) = 0x2000000000000000;
        local_288[0].data = *(uchar **)((long)local_4b8 + lVar106 * 0x110 + 0x40);
        local_288[0]._8_8_ = *(undefined8 *)((long)local_4b8 + lVar106 * 0x110 + 0x48);
        iVar103 = local_288[0].cursor;
        iVar92 = local_288[0].size;
        uVar189 = local_288[0].cursor + 2;
        if (local_288[0].cursor < -2 || local_288[0].size < (int)uVar189) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                      ,0x46c,"stbtt__buf_seek","ImGui ASSERT FAILED: %s");
        }
        if (iVar92 < (int)uVar189) {
          uVar189 = iVar92;
        }
        if (iVar103 < -2) {
          uVar189 = iVar92;
        }
        uVar105 = 0;
        local_288[0].cursor = uVar189;
        if ((int)uVar189 < iVar92) {
          local_288[0].cursor = uVar189 + 1;
          uVar105 = (uint)local_288[0].data[(int)uVar189];
        }
        if (iVar92 < (int)uVar105) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                      ,0x46c,"stbtt__buf_seek","ImGui ASSERT FAILED: %s");
          uVar105 = iVar92;
        }
        local_288[0].cursor = uVar105;
        stbtt__cff_get_index(local_288);
        sVar188 = stbtt__cff_get_index(local_288);
        local_468 = (undefined1  [16])stbtt__cff_index_get(sVar188,0);
        stbtt__cff_get_index(local_288);
        sVar188 = stbtt__cff_get_index(local_288);
        *(stbtt__buf *)((long)local_4b8 + lVar106 * 0x110 + 0x60) = sVar188;
        stbtt__dict_get_ints((stbtt__buf *)local_468,0x11,1,(stbtt_uint32 *)local_458);
        stbtt__dict_get_ints((stbtt__buf *)local_468,0x106,1,(stbtt_uint32 *)&local_428);
        stbtt__dict_get_ints((stbtt__buf *)local_468,0x124,1,(stbtt_uint32 *)&local_408);
        stbtt__dict_get_ints((stbtt__buf *)local_468,0x125,1,&local_47c);
        sVar188._4_12_ = in_stack_fffffffffffffb0c;
        sVar188.data._0_4_ = in_stack_fffffffffffffb08;
        fontdict.cursor = sVar71;
        fontdict.data = (uchar *)in_stack_fffffffffffffb30;
        fontdict.size = iVar72;
        sVar188 = stbtt__get_subrs(sVar188,fontdict);
        sVar67 = (stbtt_uint32)local_408;
        sVar66 = local_47c;
        *(stbtt__buf *)((long)local_4b8 + lVar106 * 0x110 + 0x70) = sVar188;
        if (((stbtt_uint32)local_428 != 2) || (uVar147 = local_458._0_4_, local_458._0_4_ == 0))
        goto LAB_001cfc30;
        if ((stbtt_uint32)local_408 != 0) {
          uVar73 = (ulong)local_47c;
          if (uVar73 == 0) goto LAB_001cfc30;
          iVar103 = local_288[0].size;
          if ((int)(stbtt_uint32)local_408 < 0 || local_288[0].size < (int)(stbtt_uint32)local_408)
          {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                        ,0x46c,"stbtt__buf_seek","ImGui ASSERT FAILED: %s");
          }
          sVar68 = sVar67;
          if (iVar103 < (int)sVar67) {
            sVar68 = iVar103;
          }
          if ((int)sVar67 < 0) {
            sVar68 = iVar103;
          }
          local_288[0].cursor = sVar68;
          sVar188 = stbtt__cff_get_index(local_288);
          *(stbtt__buf *)((long)local_4b8 + lVar106 * 0x110 + 0x80) = sVar188;
          puVar78 = local_288[0].data + uVar73;
          lVar75 = (ulong)(local_288[0].size - sVar66) << 0x20;
          if ((int)(local_288[0].size - sVar66 | sVar66) < 0 || local_288[0].size < (int)sVar66) {
            puVar78 = (uchar *)0x0;
            lVar75 = 0;
          }
          *(uchar **)((long)local_4b8 + lVar106 * 0x110 + 0x90) = puVar78;
          *(long *)((long)local_4b8 + lVar106 * 0x110 + 0x98) = lVar75;
        }
        iVar103 = local_288[0].size;
        if ((int)uVar147 < 0 || local_288[0].size < (int)uVar147) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                      ,0x46c,"stbtt__buf_seek","ImGui ASSERT FAILED: %s");
        }
        sVar66 = uVar147;
        if (iVar103 < (int)uVar147) {
          sVar66 = iVar103;
        }
        if ((int)uVar147 < 0) {
          sVar66 = iVar103;
        }
        local_288[0].cursor = sVar66;
        sVar188 = stbtt__cff_get_index(local_288);
        *(stbtt__buf *)((long)local_4b8 + lVar106 * 0x110 + 0x50) = sVar188;
      }
      else if (sVar66 == 0) goto LAB_001cfc30;
      sVar71 = stbtt__find_table(data,sVar71,"maxp");
      if (sVar71 == 0) {
        uVar189 = 0xffff;
      }
      else {
        uVar189 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar71 + 4) << 8 |
                                *(ushort *)(data + (ulong)sVar71 + 4) >> 8);
      }
      *(uint *)((long)local_4b8 + lVar106 * 0x110 + 0x14) = uVar189;
      uVar64 = *(ushort *)(data + (local_478._0_8_ & 0xffffffff) + 2) << 8 |
               *(ushort *)(data + (local_478._0_8_ & 0xffffffff) + 2) >> 8;
      *(undefined4 *)((long)local_4b8 + lVar106 * 0x110 + 0x34) = 0;
      if (uVar64 != 0) {
        uVar189 = local_478._0_4_ + 4;
        uVar73 = (ulong)uVar64;
        do {
          uVar64 = *(ushort *)(data + uVar189) << 8 | *(ushort *)(data + uVar189) >> 8;
          if ((uVar64 == 0) ||
             ((uVar64 == 3 &&
              ((uVar64 = *(ushort *)(data + (ulong)uVar189 + 2) << 8 |
                         *(ushort *)(data + (ulong)uVar189 + 2) >> 8, uVar64 == 10 || (uVar64 == 1))
              )))) {
            uVar105 = *(uint *)(data + (ulong)uVar189 + 4);
            *(uint *)((long)local_4b8 + lVar106 * 0x110 + 0x34) =
                 (uVar105 >> 0x18 | (uVar105 & 0xff0000) >> 8 | (uVar105 & 0xff00) << 8 |
                 uVar105 << 0x18) + local_478._0_4_;
          }
          uVar189 = uVar189 + 8;
          uVar73 = uVar73 - 1;
        } while (uVar73 != 0);
      }
      if (*(int *)((long)local_4b8 + lVar106 * 0x110 + 0x34) == 0) goto LAB_001cfc30;
      uVar189 = 0;
      iVar72 = 0;
      *(uint *)((long)local_4b8 + lVar106 * 0x110 + 0x38) =
           (uint)(ushort)(*(ushort *)
                           (data + (long)*(int *)((long)local_4b8 + lVar106 * 0x110 + 0x1c) + 0x32)
                          << 8 | *(ushort *)
                                  (data + (long)*(int *)((long)local_4b8 + lVar106 * 0x110 + 0x1c) +
                                          0x32) >> 8);
      iVar103 = *(int *)((long)local_4b8 + lVar106 * 0x110 + 0xe0);
      if ((int)uVar91 <= iVar103) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
      }
      pIVar74 = pIVar14->GlyphRanges;
      if (pIVar74 == (ImWchar *)0x0) {
        pIVar74 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)local_4b8 + lVar106 * 0x110 + 0xd8) = pIVar74;
      IVar12 = *pIVar74;
      while (IVar12 != 0) {
        uVar64 = pIVar74[1];
        if (uVar64 == 0) break;
        uVar105 = *(uint *)((long)local_4b8 + lVar106 * 0x110 + 0xe4);
        uVar101 = (uint)uVar64;
        if ((int)(uint)uVar64 < (int)uVar105) {
          uVar101 = uVar105;
        }
        *(uint *)((long)local_4b8 + lVar106 * 0x110 + 0xe4) = uVar101;
        IVar12 = pIVar74[2];
        pIVar74 = pIVar74 + 2;
      }
      piVar88 = (int *)((long)iVar103 * 0x20 + (long)local_430);
      *piVar88 = *piVar88 + 1;
      iVar103 = *(int *)((long)local_4b8 + lVar106 * 0x110 + 0xe4);
      if (iVar103 < piVar88[1]) {
        iVar103 = piVar88[1];
      }
      piVar88[1] = iVar103;
      lVar106 = lVar106 + 1;
      lVar75 = (long)(atlas->ConfigData).Size;
      local_4d9 = lVar75 <= lVar106;
    } while (lVar106 < lVar75);
  }
  if (0 < (int)uVar13) {
    lVar106 = 0;
    uVar189 = 0;
    do {
      iVar103 = *(int *)((long)local_4b8 + lVar106 * 0x110 + 0xe0);
      if ((int)uVar91 <= iVar103) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
      }
      psVar93 = (stbtt_fontinfo *)(lVar106 * 0x110 + (long)local_4b8);
      ImBitVector::Create((ImBitVector *)&psVar93[1].charstrings,
                          *(int *)((long)&psVar93[1].cff.data + 4) + 1);
      pvVar77 = local_430;
      this = (ImBitVector *)((long)local_430 + (long)iVar103 * 0x20 + 0x10);
      if (*(int *)((long)local_430 + (long)iVar103 * 0x20 + 0x10) == 0) {
        ImBitVector::Create(this,*(int *)((long)local_430 + (long)iVar103 * 0x20 + 4) + 1);
      }
      puVar100 = *(ushort **)&psVar93[1].indexToLocFormat;
      uVar64 = *puVar100;
      for (; (uVar64 != 0 && (puVar100[1] != 0)); puVar100 = puVar100 + 2) {
        if (uVar64 <= puVar100[1]) {
          uVar105 = (uint)uVar64;
          do {
            bVar63 = ImBitVector::TestBit(this,uVar105);
            if ((!bVar63) && (iVar72 = stbtt_FindGlyphIndex(psVar93,uVar105), iVar72 != 0)) {
              piVar88 = &psVar93[1].cff.cursor;
              *piVar88 = *piVar88 + 1;
              piVar88 = (int *)((long)pvVar77 + (long)iVar103 * 0x20 + 8);
              *piVar88 = *piVar88 + 1;
              ImBitVector::SetBit((ImBitVector *)&psVar93[1].charstrings,uVar105);
              ImBitVector::SetBit(this,uVar105);
              uVar189 = uVar189 + 1;
            }
            bVar63 = uVar105 < puVar100[1];
            uVar105 = uVar105 + 1;
          } while (bVar63);
        }
        uVar64 = puVar100[2];
      }
      lVar106 = lVar106 + 1;
    } while (lVar106 != lVar83);
  }
  if (0 < (int)uVar13) {
    lVar106 = 0;
    do {
      local_478._0_8_ = lVar106;
      lVar106 = lVar106 * 0x110;
      iVar103 = *(int *)((long)local_4b8 + lVar106 + 0xe8);
      if (*(int *)((long)local_4b8 + lVar106 + 0x104) < iVar103) {
        pvVar76 = ImGui::MemAlloc((long)iVar103 << 2);
        pvVar77 = *(void **)((long)local_4b8 + lVar106 + 0x108);
        if (pvVar77 != (void *)0x0) {
          memcpy(pvVar76,pvVar77,(long)*(int *)((long)local_4b8 + lVar106 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)local_4b8 + lVar106 + 0x108));
        }
        *(void **)((long)local_4b8 + lVar106 + 0x108) = pvVar76;
        *(int *)((long)local_4b8 + lVar106 + 0x104) = iVar103;
      }
      lVar75 = (long)*(int *)((long)local_4b8 + lVar106 + 0xf0);
      if (0 < lVar75) {
        puVar84 = *(uint **)((long)local_4b8 + lVar106 + 0xf8);
        puVar1 = puVar84 + lVar75;
        local_498._0_8_ = puVar1;
        iVar103 = 0;
        do {
          uVar105 = *puVar84;
          if (uVar105 != 0) {
            uVar101 = 0;
            do {
              if ((uVar105 >> (uVar101 & 0x1f) & 1) != 0) {
                iVar72 = *(int *)((long)local_4b8 + lVar106 + 0x100);
                iVar92 = *(int *)((long)local_4b8 + lVar106 + 0x104);
                if (iVar72 == iVar92) {
                  if (iVar92 == 0) {
                    iVar82 = 8;
                  }
                  else {
                    iVar82 = iVar92 / 2 + iVar92;
                  }
                  iVar72 = iVar72 + 1;
                  if (iVar72 < iVar82) {
                    iVar72 = iVar82;
                  }
                  if (iVar92 < iVar72) {
                    pvVar76 = ImGui::MemAlloc((long)iVar72 << 2);
                    pvVar77 = *(void **)((long)local_4b8 + lVar106 + 0x108);
                    if (pvVar77 != (void *)0x0) {
                      memcpy(pvVar76,pvVar77,(long)*(int *)((long)local_4b8 + lVar106 + 0x100) << 2)
                      ;
                      ImGui::MemFree(*(void **)((long)local_4b8 + lVar106 + 0x108));
                    }
                    *(void **)((long)local_4b8 + lVar106 + 0x108) = pvVar76;
                    *(int *)((long)local_4b8 + lVar106 + 0x104) = iVar72;
                  }
                }
                *(uint *)(*(long *)((long)local_4b8 + lVar106 + 0x108) +
                         (long)*(int *)((long)local_4b8 + lVar106 + 0x100) * 4) = iVar103 + uVar101;
                piVar88 = (int *)((long)local_4b8 + lVar106 + 0x100);
                *piVar88 = *piVar88 + 1;
              }
              uVar101 = uVar101 + 1;
            } while (uVar101 != 0x20);
          }
          puVar84 = puVar84 + 1;
          iVar103 = iVar103 + 0x20;
        } while (puVar84 < puVar1);
      }
      pvVar77 = *(void **)((long)local_4b8 + lVar106 + 0xf8);
      if (pvVar77 != (void *)0x0) {
        *(undefined8 *)((long)local_4b8 + lVar106 + 0xf0) = 0;
        ImGui::MemFree(pvVar77);
        *(undefined8 *)((long)local_4b8 + lVar106 + 0xf8) = 0;
      }
      if (*(int *)((long)local_4b8 + lVar106 + 0x100) != *(int *)((long)local_4b8 + lVar106 + 0xe8))
      {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                    ,0x87d,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s");
      }
      lVar106 = local_478._0_8_ + 1;
    } while (lVar106 != lVar83);
  }
  pvVar77 = local_430;
  if (0 < (int)uVar91) {
    lVar106 = 0;
    do {
      pvVar76 = *(void **)((long)pvVar77 + lVar106 + 0x18);
      if (pvVar76 != (void *)0x0) {
        *(undefined8 *)((long)pvVar77 + lVar106 + 0x10) = 0;
        ImGui::MemFree(pvVar76);
        *(undefined8 *)((long)pvVar77 + lVar106 + 0x18) = 0;
      }
      lVar106 = lVar106 + 0x20;
    } while (local_3f8._0_8_ != lVar106);
  }
  if (local_430 != (void *)0x0) {
    ImGui::MemFree(local_430);
    local_430 = (void *)0x0;
  }
  local_468 = ZEXT816(0);
  local_428 = 0;
  pvStack_420 = (void *)0x0;
  if (0 < (int)uVar189) {
    uVar91 = 8;
    if (7 < (int)uVar189) {
      uVar91 = uVar189;
    }
    if (0 < (int)uVar91) {
      pvVar77 = ImGui::MemAlloc((long)(int)uVar91 << 4);
      if ((void *)local_468._8_8_ != (void *)0x0) {
        memcpy(pvVar77,(void *)local_468._8_8_,(long)(int)local_468._0_4_ << 4);
        ImGui::MemFree((void *)local_468._8_8_);
      }
      auVar126._4_8_ = pvVar77;
      auVar126._0_4_ = uVar91;
      auVar126._12_4_ = 0;
      local_468 = auVar126 << 0x20;
    }
  }
  local_468._0_4_ = uVar189;
  if (local_428._4_4_ < (int)uVar189) {
    if (local_428._4_4_ == 0) {
      uVar91 = 8;
    }
    else {
      uVar91 = local_428._4_4_ / 2 + local_428._4_4_;
    }
    if ((int)uVar91 <= (int)uVar189) {
      uVar91 = uVar189;
    }
    if (local_428._4_4_ < (int)uVar91) {
      pvVar77 = ImGui::MemAlloc((long)(int)uVar91 * 0x1c);
      if (pvStack_420 != (void *)0x0) {
        memcpy(pvVar77,pvStack_420,(long)(int)(stbtt_uint32)local_428 * 0x1c);
        ImGui::MemFree(pvStack_420);
      }
      local_428 = (ulong)uVar91 << 0x20;
      pvStack_420 = pvVar77;
    }
  }
  local_428 = CONCAT44(local_428._4_4_,uVar189);
  memset((void *)local_468._8_8_,0,(long)(int)local_468._0_4_ << 4);
  memset(pvStack_420,0,(long)(int)(stbtt_uint32)local_428 * 0x1c);
  fVar124 = 0.0;
  if (0 < (int)uVar13) {
    lVar106 = 0;
    iVar92 = 0;
    iVar103 = 0;
    iVar72 = 0;
    do {
      if (*(int *)((long)local_4b8 + lVar106 * 0x110 + 0xe8) != 0) {
        if ((int)local_468._0_4_ <= iVar103) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
        }
        psVar93 = (stbtt_fontinfo *)(lVar106 * 0x110 + (long)local_4b8);
        *(long *)&psVar93[1].hmtx = (long)iVar103 * 0x10 + local_468._8_8_;
        if ((int)(stbtt_uint32)local_428 <= iVar72) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
        }
        local_498._0_4_ = iVar72;
        *(void **)&psVar93[1].gpos = (void *)((long)iVar72 * 0x1c + (long)pvStack_420);
        iVar82 = psVar93[1].cff.cursor;
        if ((atlas->ConfigData).Size <= lVar106) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
        }
        pIVar14 = (atlas->ConfigData).Data;
        fVar124 = pIVar14[lVar106].SizePixels;
        *(float *)&psVar93[1].userdata = fVar124;
        *(undefined4 *)((long)&psVar93[1].userdata + 4) = 0;
        psVar93[1].data = *(uchar **)&psVar93[1].gsubrs.cursor;
        psVar93[1].fontstart = *(int *)&psVar93[1].gsubrs.data;
        psVar93[1].loca = psVar93[1].gpos;
        psVar93[1].head = psVar93[1].index_map;
        *(char *)&psVar93[1].glyf = (char)pIVar14[lVar106].OversampleH;
        *(char *)((long)&psVar93[1].glyf + 1) = (char)pIVar14[lVar106].OversampleV;
        if (fVar124 <= 0.0) {
          fVar124 = -fVar124;
          uVar91 = (uint)(ushort)(*(ushort *)(psVar93->data + (long)psVar93->head + 0x12) << 8 |
                                 *(ushort *)(psVar93->data + (long)psVar93->head + 0x12) >> 8);
        }
        else {
          puVar78 = psVar93->data;
          lVar75 = (long)psVar93->hhea;
          uVar91 = ((int)(short)((ushort)puVar78[lVar75 + 4] << 8) | (uint)puVar78[lVar75 + 5]) -
                   ((int)(short)((ushort)puVar78[lVar75 + 6] << 8) | (uint)puVar78[lVar75 + 7]);
        }
        fVar124 = fVar124 / (float)(int)uVar91;
        iVar103 = iVar103 + iVar82;
        iVar72 = iVar72 + iVar82;
        if (0 < *(int *)&psVar93[1].gsubrs.data) {
          local_498._0_4_ = iVar72;
          local_478._0_4_ = iVar103;
          iVar103 = atlas->TexGlyphPadding;
          lVar102 = 6;
          lVar75 = 0;
          do {
            if (*(int *)&psVar93[1].gsubrs.data <= lVar75) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                          ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
            }
            iVar82 = stbtt_FindGlyphIndex
                               (psVar93,*(int *)(*(long *)&psVar93[1].gsubrs.cursor + lVar75 * 4));
            if (iVar82 == 0) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                          ,0x8ac,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s",
                          "glyph_index_in_font != 0");
            }
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar93,iVar82,(float)pIVar14[lVar106].OversampleH * fVar124,
                       (float)pIVar14[lVar106].OversampleV * fVar124,fVar124,in_XMM3._0_4_,
                       (int *)local_288,(int *)local_458,(int *)&local_408,(int *)&local_47c);
            uVar91 = (pIVar14[lVar106].OversampleH +
                     (((stbtt_uint32)local_408 + iVar103) - (int)local_288[0].data)) - 1;
            lVar86 = *(long *)&psVar93[1].hmtx;
            *(short *)(lVar86 + -2 + lVar102) = (short)uVar91;
            uVar189 = (pIVar14[lVar106].OversampleV + ((local_47c + iVar103) - local_458._0_4_)) - 1
            ;
            *(short *)(lVar86 + lVar102) = (short)uVar189;
            iVar92 = iVar92 + (uVar189 & 0xffff) * (uVar91 & 0xffff);
            lVar75 = lVar75 + 1;
            lVar102 = lVar102 + 0x10;
          } while (lVar75 < *(int *)&psVar93[1].gsubrs.data);
          iVar103 = local_478._0_4_;
        }
      }
      lVar106 = lVar106 + 1;
    } while (lVar106 != lVar83);
    fVar124 = (float)iVar92;
  }
  if (fVar124 < 0.0) {
    fVar124 = sqrtf(fVar124);
  }
  else {
    fVar124 = SQRT(fVar124);
  }
  atlas->TexHeight = 0;
  local_458._8_4_ = atlas->TexDesiredWidth;
  if ((int)local_458._8_4_ < 1) {
    iVar103 = (int)fVar124;
    local_458._8_4_ = 5.73972e-42;
    if ((iVar103 < 0xb33) && (local_458._8_4_ = 2.86986e-42, iVar103 < 0x599)) {
      local_458._8_4_ = (uint)(0x2cb < iVar103) * 0x200 + 0x200;
    }
  }
  atlas->TexWidth = local_458._8_4_;
  uVar91 = atlas->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar103 = local_458._8_4_ - uVar91;
  local_418 = (stbrp_node *)ImGui::MemAlloc((long)iVar103 << 4);
  if ((ptr == (stbrp_context *)0x0) || (local_418 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_418 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_418);
    }
    local_418 = (stbrp_node *)0x0;
    uVar91 = 0;
    local_458._8_4_ = 0.0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (((int)uVar91 < -0x7fff) || (0xffff < iVar103)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                  ,0x10a,"stbrp_init_target","ImGui ASSERT FAILED: %s");
    }
    if (iVar103 < 2) {
      uVar73 = 0;
    }
    else {
      uVar73 = 0;
      psVar36 = local_418;
      do {
        uVar73 = uVar73 + 1;
        psVar36->next = psVar36 + 1;
        psVar36 = psVar36 + 1;
      } while (iVar103 - 1 != uVar73);
      uVar73 = uVar73 & 0xffffffff;
    }
    local_418[uVar73].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_418;
    ptr->active_head = ptr->extra;
    ptr->width = iVar103;
    ptr->height = 0x8000 - uVar91;
    ptr->num_nodes = iVar103;
    ptr->align = (iVar103 * 2 + -1) / iVar103;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar103;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_358 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas,ptr);
  if (0 < (int)uVar13) {
    lVar106 = 0;
    do {
      lVar75 = lVar106 * 0x110;
      iVar103 = *(int *)((long)local_4b8 + lVar75 + 0xe8);
      if (iVar103 != 0) {
        stbrp_pack_rects(local_358,*(stbrp_rect **)((long)local_4b8 + lVar75 + 200),iVar103);
        lVar102 = (long)*(int *)((long)local_4b8 + lVar75 + 0xe8);
        if (0 < lVar102) {
          lVar75 = *(long *)((long)local_4b8 + lVar75 + 200);
          lVar86 = 0;
          do {
            if (*(int *)(lVar75 + 0xc + lVar86) != 0) {
              iVar103 = (uint)*(ushort *)(lVar75 + 6 + lVar86) +
                        (uint)*(ushort *)(lVar75 + 10 + lVar86);
              if (iVar103 < atlas->TexHeight) {
                iVar103 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar103;
            }
            lVar86 = lVar86 + 0x10;
          } while (lVar102 * 0x10 != lVar86);
        }
      }
      lVar106 = lVar106 + 1;
    } while (lVar106 != lVar83);
  }
  uVar189 = atlas->TexHeight;
  if ((atlas->Flags & 1) == 0) {
    uVar189 = (int)(uVar189 - 1) >> 1 | uVar189 - 1;
    uVar189 = (int)uVar189 >> 2 | uVar189;
    uVar189 = (int)uVar189 >> 4 | uVar189;
    uVar189 = (int)uVar189 >> 8 | uVar189;
    uVar189 = (int)uVar189 >> 0x10 | uVar189;
  }
  iVar103 = uVar189 + 1;
  atlas->TexHeight = iVar103;
  auVar152._0_4_ = (float)atlas->TexWidth;
  auVar152._4_4_ = (float)iVar103;
  auVar152._8_8_ = 0;
  auVar126 = divps(_DAT_0024d380,auVar152);
  atlas->TexUvScale = auVar126._0_8_;
  puVar78 = (uchar *)ImGui::MemAlloc((long)(iVar103 * atlas->TexWidth));
  atlas->TexPixelsAlpha8 = puVar78;
  memset(puVar78,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
  if (0 < (int)uVar13) {
    local_398 = atlas->TexPixelsAlpha8;
    local_440 = (long)(int)local_458._8_4_;
    local_68 = pshuflw(ZEXT416(uVar91),ZEXT416(uVar91),0);
    lVar106 = 0;
    do {
      if ((atlas->ConfigData).Size <= lVar106) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
      }
      if (*(int *)((long)local_4b8 + lVar106 * 0x110 + 0xe8) != 0) {
        psVar93 = (stbtt_fontinfo *)(lVar106 * 0x110 + (long)local_4b8);
        fVar124 = *(float *)&psVar93[1].userdata;
        if (fVar124 <= 0.0) {
          auVar162._4_4_ = 0x80000000;
          auVar162._0_4_ = -fVar124;
          auVar162._8_4_ = 0x80000000;
          auVar162._12_4_ = 0x80000000;
          uVar91 = (uint)(ushort)(*(ushort *)(psVar93->data + (long)psVar93->head + 0x12) << 8 |
                                 *(ushort *)(psVar93->data + (long)psVar93->head + 0x12) >> 8);
        }
        else {
          puVar78 = psVar93->data;
          lVar75 = (long)psVar93->hhea;
          uVar91 = ((int)(short)((ushort)puVar78[lVar75 + 4] << 8) | (uint)puVar78[lVar75 + 5]) -
                   ((int)(short)((ushort)puVar78[lVar75 + 6] << 8) | (uint)puVar78[lVar75 + 7]);
          auVar162 = ZEXT416((uint)fVar124);
        }
        local_328._4_12_ = auVar162._4_12_;
        local_328._0_4_ = auVar162._0_4_ / (float)(int)uVar91;
        local_308 = (atlas->ConfigData).Data;
        if (0 < psVar93[1].fontstart) {
          lVar75._0_4_ = psVar93[1].hmtx;
          lVar75._4_4_ = psVar93[1].kern;
          local_298._0_4_ = psVar93[1].glyf;
          local_298._4_4_ = psVar93[1].hhea;
          uStack_290 = 0;
          auVar38._8_6_ = 0;
          auVar38._0_8_ = local_298;
          auVar38[0xe] = (char)((uint)local_298._4_4_ >> 0x18);
          auVar40._8_4_ = 0;
          auVar40._0_8_ = local_298;
          auVar40[0xc] = (char)((uint)local_298._4_4_ >> 0x10);
          auVar40._13_2_ = auVar38._13_2_;
          auVar41._8_4_ = 0;
          auVar41._0_8_ = local_298;
          auVar41._12_3_ = auVar40._12_3_;
          auVar42._8_2_ = 0;
          auVar42._0_8_ = local_298;
          auVar42[10] = (char)((uint)local_298._4_4_ >> 8);
          auVar42._11_4_ = auVar41._11_4_;
          auVar45._8_2_ = 0;
          auVar45._0_8_ = local_298;
          auVar45._10_5_ = auVar42._10_5_;
          auVar46[8] = (char)local_298._4_4_;
          auVar46._0_8_ = local_298;
          auVar46._9_6_ = auVar45._9_6_;
          auVar48._7_8_ = 0;
          auVar48._0_7_ = auVar46._8_7_;
          cVar120 = (char)((uint)(undefined4)local_298 >> 0x18);
          Var49 = CONCAT81(SUB158(auVar48 << 0x40,7),cVar120);
          auVar55._9_6_ = 0;
          auVar55._0_9_ = Var49;
          cVar117 = (char)((uint)(undefined4)local_298 >> 0x10);
          auVar50._1_10_ = SUB1510(auVar55 << 0x30,5);
          auVar50[0] = cVar117;
          auVar56._11_4_ = 0;
          auVar56._0_11_ = auVar50;
          bVar116 = (byte)((uint)(undefined4)local_298 >> 8);
          auVar51._1_12_ = SUB1512(auVar56 << 0x20,3);
          auVar51[0] = bVar116;
          bVar110 = (byte)(undefined4)local_298;
          uVar64 = CONCAT11(0,bVar110);
          auVar47._2_13_ = auVar51;
          auVar47._0_2_ = uVar64;
          uVar118 = auVar51._0_2_;
          sVar111 = -auVar50._0_2_;
          sVar121 = (short)Var49;
          sVar119 = -sVar121;
          auVar39._10_2_ = 0;
          auVar39._0_10_ = auVar47._0_10_;
          auVar39._12_2_ = sVar121;
          uVar58 = CONCAT42(auVar39._10_4_,auVar50._0_2_);
          auVar52._6_8_ = 0;
          auVar52._0_6_ = uVar58;
          auVar43._4_2_ = uVar118;
          auVar43._0_4_ = auVar47._0_4_;
          auVar43._6_8_ = SUB148(auVar52 << 0x40,6);
          auVar177._0_4_ = (float)uVar64;
          auVar177._4_4_ = (float)auVar43._4_4_;
          auVar177._8_4_ = (float)(int)uVar58;
          auVar177._12_4_ = (float)(auVar39._10_4_ >> 0x10);
          local_58 = divps(_DAT_0024d380,auVar177);
          auVar136[0] = -(bVar110 == 0);
          auVar136[1] = -(bVar110 == 0);
          auVar136[2] = -(bVar110 == 0);
          auVar136[3] = -(bVar110 == 0);
          auVar136[4] = -(bVar116 == 0);
          auVar136[5] = -(bVar116 == 0);
          auVar136[6] = -(bVar116 == 0);
          auVar136[7] = -(bVar116 == 0);
          auVar136[8] = -(cVar117 == '\0');
          auVar136[9] = -(cVar117 == '\0');
          auVar136[10] = -(cVar117 == '\0');
          auVar136[0xb] = -(cVar117 == '\0');
          auVar136[0xc] = -(cVar120 == '\0');
          auVar136[0xd] = -(cVar120 == '\0');
          auVar136[0xe] = -(cVar120 == '\0');
          auVar136[0xf] = -(cVar120 == '\0');
          Var57 = CONCAT64(CONCAT42(CONCAT22(sVar119,sVar119),sVar111),CONCAT22(sVar111,sVar119));
          auVar53._4_8_ = (long)((unkuint10)Var57 >> 0x10);
          auVar53._2_2_ = 1 - uVar118;
          auVar53._0_2_ = 1 - uVar118;
          auVar127._0_4_ = (float)(int)(short)(1 - uVar64);
          auVar127._4_4_ = (float)(auVar53._0_4_ >> 0x10);
          auVar127._8_4_ = (float)((int)((unkuint10)Var57 >> 0x10) >> 0x10);
          auVar127._12_4_ = (float)(int)sVar119;
          local_2a8._0_4_ = (float)local_328._0_4_ * auVar177._0_4_;
          local_2a8._4_4_ = (float)local_328._0_4_ * auVar177._4_4_;
          local_2a8._8_4_ = (float)local_328._0_4_ * auVar177._8_4_;
          local_2a8._12_4_ = (float)local_328._0_4_ * auVar177._12_4_;
          auVar115._0_4_ = auVar177._0_4_ + auVar177._0_4_;
          auVar115._4_4_ = auVar177._4_4_ + auVar177._4_4_;
          auVar115._8_4_ = auVar177._8_4_ + auVar177._8_4_;
          auVar115._12_4_ = auVar177._12_4_ + auVar177._12_4_;
          auVar126 = divps(auVar127,auVar115);
          local_48 = ~auVar136 & auVar126;
          fVar124 = local_2a8._4_4_;
          if ((float)local_2a8._0_4_ <= local_2a8._4_4_) {
            fVar124 = (float)local_2a8._0_4_;
          }
          local_3bc = (0.35 / fVar124) * (0.35 / fVar124);
          local_2b8 = local_2a8._4_4_;
          fStack_2b4 = local_2a8._4_4_;
          fStack_2b0 = local_2a8._4_4_;
          fStack_2ac = local_2a8._4_4_;
          local_340 = local_298 & 0xff;
          local_348 = (ulong)bVar116;
          uVar73 = CONCAT44(local_2a8._4_4_,local_2a8._0_4_);
          auVar133._0_8_ = uVar73 ^ 0x8000000000000000;
          auVar133._8_4_ = local_2a8._0_4_;
          auVar133._12_4_ = -local_2a8._4_4_;
          _local_78 = auVar133;
          lVar102 = 0;
          local_2f8 = lVar106;
          local_300 = lVar75;
          local_3a8 = psVar93;
          local_3e0 = (ulong)uVar118;
          local_3c8 = (ulong)(auVar47._0_4_ & 0xffff);
          do {
            fVar124 = auVar133._0_4_;
            if (((*(int *)(lVar75 + 0xc + lVar102 * 0x10) != 0) &&
                (lVar86 = lVar102 * 0x10 + lVar75, *(short *)(lVar86 + 4) != 0)) &&
               (*(short *)(lVar86 + 6) != 0)) {
              if (psVar93[1].data == (uchar *)0x0) {
                iVar103 = *(int *)((long)&psVar93[1].userdata + 4) + (int)lVar102;
              }
              else {
                iVar103 = *(int *)(psVar93[1].data + lVar102 * 4);
              }
              local_2f0 = (undefined4 *)(lVar102 * 0x1c + *(long *)&psVar93[1].loca);
              local_3d8 = lVar86;
              local_2e8 = lVar102;
              iVar72 = stbtt_FindGlyphIndex(psVar93,iVar103);
              uVar149 = *(undefined8 *)(local_3d8 + 4);
              *(ulong *)(local_3d8 + 4) =
                   CONCAT44(CONCAT22((short)((ulong)uVar149 >> 0x30) + local_68._6_2_,
                                     (short)((ulong)uVar149 >> 0x20) + local_68._4_2_),
                            CONCAT22((short)((ulong)uVar149 >> 0x10) - local_68._2_2_,
                                     (short)uVar149 - local_68._0_2_));
              puVar78 = local_3a8->data;
              uVar64 = *(ushort *)(puVar78 + (long)local_3a8->hhea + 0x22) << 8 |
                       *(ushort *)(puVar78 + (long)local_3a8->hhea + 0x22) >> 8;
              iVar103 = local_3a8->hmtx;
              lVar106 = (ulong)uVar64 * 4 + (long)iVar103 + -4;
              lVar75 = (ulong)uVar64 * 4 + (long)iVar103 + -3;
              if (iVar72 < (int)(uint)uVar64) {
                lVar106 = (long)(iVar72 * 4) + (long)iVar103;
                lVar75 = (long)(iVar72 * 4) + 1 + (long)iVar103;
              }
              local_370 = (uint)puVar78[lVar106];
              local_374 = (uint)puVar78[lVar75];
              auVar126 = local_68;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (local_3a8,iVar72,(float)local_2a8._0_4_,local_2b8,local_68._0_4_,fVar124,
                         &local_360,&local_364,&local_2bc,&local_2c0);
              fVar112 = auVar126._0_4_;
              uVar64 = *(ushort *)(local_3d8 + 8);
              local_388 = (uchar *)(ulong)*(ushort *)(local_3d8 + 10);
              local_410 = (ulong)*(ushort *)(local_3d8 + 4);
              local_3a0 = (ulong)*(ushort *)(local_3d8 + 6);
              uVar91 = stbtt_GetGlyphShape(local_3a8,iVar72,(stbtt_vertex **)&local_408);
              stbtt_GetGlyphBitmapBoxSubpixel
                        (local_3a8,iVar72,(float)local_2a8._0_4_,local_2b8,fVar112,fVar124,
                         (int *)&local_47c,&local_35c,(int *)0x0,(int *)0x0);
              local_3fc = ((int)local_410 - (int)local_3c8) + 1;
              if (local_3fc != 0) {
                iVar103 = ((int)local_3a0 - (int)local_3e0) + 1;
                local_478._0_4_ = iVar103;
                if (iVar103 != 0) {
                  lVar106 = CONCAT44(local_408._4_4_,(stbtt_uint32)local_408);
                  local_3f8._0_4_ = local_47c;
                  local_288[0].data = (uchar *)((ulong)local_288[0].data & 0xffffffff00000000);
                  if ((int)uVar91 < 1) {
                    uVar73 = 0;
                  }
                  else {
                    lVar75 = 0;
                    uVar73 = 0;
                    do {
                      uVar73 = (ulong)((int)uVar73 +
                                      (uint)(*(char *)(lVar106 + 0xc + lVar75) == '\x01'));
                      lVar75 = lVar75 + 0xe;
                    } while ((ulong)uVar91 * 0xe != lVar75);
                  }
                  local_3c0 = local_35c;
                  if ((int)uVar73 == 0) {
LAB_001cdfbc:
                    local_448 = (void *)0x0;
LAB_001cdfc8:
                    points = (stbtt__point *)0x0;
                  }
                  else {
                    local_448 = ImGui::MemAlloc((long)(int)uVar73 << 2);
                    if (local_448 == (void *)0x0) {
                      uVar73 = 0;
                      goto LAB_001cdfc8;
                    }
                    local_3b8._0_8_ = uVar73;
                    lVar75 = (ulong)uVar91 * 0xe;
                    iVar103 = 0;
                    points = (stbtt__point *)0x0;
                    local_498._0_4_ = uVar91;
                    lVar102 = lVar75;
                    iVar72 = 0;
                    do {
                      if (iVar72 == 0) {
LAB_001cdd85:
                        local_288[0].data = (uchar *)((ulong)local_288[0].data & 0xffffffff00000000)
                        ;
                        if ((int)uVar91 < 1) {
                          lVar86 = -1;
                        }
                        else {
                          fVar124 = 0.0;
                          fVar112 = 0.0;
                          uVar189 = 0xffffffff;
                          lVar86 = 0;
                          do {
                            puVar78 = local_288[0].data;
                            switch(*(undefined1 *)(lVar106 + 0xc + lVar86)) {
                            case 1:
                              if (-1 < (int)uVar189) {
                                *(int *)((long)local_448 + (ulong)uVar189 * 4) =
                                     (int)local_288[0].data - iVar103;
                              }
                              uVar189 = uVar189 + 1;
                              auVar126 = pshuflw(ZEXT416(*(uint *)(lVar106 + lVar86)),
                                                 ZEXT416(*(uint *)(lVar106 + lVar86)),0x60);
                              iVar92 = auVar126._0_4_;
                              iVar82 = auVar126._4_4_;
                              iVar103 = (int)local_288[0].data;
                              break;
                            case 2:
                              auVar126 = pshuflw(ZEXT416(*(uint *)(lVar106 + lVar86)),
                                                 ZEXT416(*(uint *)(lVar106 + lVar86)),0x60);
                              iVar92 = auVar126._0_4_;
                              iVar82 = auVar126._4_4_;
                              break;
                            case 3:
                              lVar75 = lVar102;
                              stbtt__tesselate_curve
                                        (points,(int *)local_288,fVar124,fVar112,
                                         (float)(int)*(short *)(lVar106 + 4 + lVar86),
                                         (float)(int)*(short *)(lVar106 + 6 + lVar86),
                                         (float)(int)*(short *)(lVar106 + lVar86),
                                         (float)(int)*(short *)(lVar106 + 2 + lVar86),local_3bc,0);
                              goto LAB_001cdef5;
                            case 4:
                              stbtt__tesselate_cubic
                                        (points,(int *)local_288,fVar124,fVar112,
                                         (float)(int)*(short *)(lVar106 + 4 + lVar86),
                                         (float)(int)*(short *)(lVar106 + 6 + lVar86),
                                         (float)(int)*(short *)(lVar106 + 8 + lVar86),
                                         (float)(int)*(short *)(lVar106 + 10 + lVar86),
                                         (float)(int)*(short *)(lVar106 + lVar86),
                                         (float)(int)*(short *)(lVar106 + 2 + lVar86),local_3bc,0);
                              lVar75 = lVar102;
LAB_001cdef5:
                              auVar126 = pshuflw(ZEXT416(*(uint *)(lVar106 + lVar86)),
                                                 ZEXT416(*(uint *)(lVar106 + lVar86)),0x60);
                              fVar124 = (float)(auVar126._0_4_ >> 0x10);
                              fVar112 = (float)(auVar126._4_4_ >> 0x10);
                              puVar78 = local_288[0].data;
                              lVar102 = lVar75;
                            default:
                              goto switchD_001cddc9_default;
                            }
                            puVar78 = (uchar *)CONCAT44(local_288[0].data._4_4_,
                                                        (int)local_288[0].data + 1);
                            fVar112 = (float)(iVar82 >> 0x10);
                            fVar124 = (float)(iVar92 >> 0x10);
                            if (points != (stbtt__point *)0x0) {
                              points[(int)local_288[0].data].x = fVar124;
                              points[(int)local_288[0].data].y = fVar112;
                            }
switchD_001cddc9_default:
                            local_288[0].data = puVar78;
                            lVar86 = lVar86 + 0xe;
                          } while (lVar75 != lVar86);
                          lVar86 = (long)(int)uVar189;
                        }
                        *(int *)((long)local_448 + lVar86 * 4) = (int)local_288[0].data - iVar103;
                        bVar63 = true;
                      }
                      else {
                        points = (stbtt__point *)ImGui::MemAlloc((long)(int)local_288[0].data << 3);
                        if (points != (stbtt__point *)0x0) goto LAB_001cdd85;
                        points = (stbtt__point *)0x0;
                        bVar63 = false;
                      }
                      if (!bVar63) {
                        ImGui::MemFree(points);
                        ImGui::MemFree(local_448);
                        uVar73 = 0;
                        goto LAB_001cdfbc;
                      }
                      bVar63 = iVar72 == 0;
                      iVar72 = iVar72 + 1;
                    } while (bVar63);
                    uVar73 = local_3b8._0_8_;
                  }
                  local_390 = points;
                  if (points != (stbtt__point *)0x0) {
                    if ((int)uVar73 < 1) {
                      size = 0x14;
                    }
                    else {
                      uVar96 = 0;
                      lVar106 = 0;
                      do {
                        lVar106 = (long)(int)lVar106 + (long)*(int *)((long)local_448 + uVar96 * 4);
                        uVar96 = uVar96 + 1;
                      } while ((uVar73 & 0xffffffff) != uVar96);
                      size = lVar106 * 0x14 + 0x14;
                    }
                    psVar79 = (stbtt__edge *)ImGui::MemAlloc(size);
                    lVar106 = local_440;
                    if (psVar79 != (stbtt__edge *)0x0) {
                      if ((int)uVar73 < 1) {
                        uVar91 = 0;
                      }
                      else {
                        uVar96 = 0;
                        uVar91 = 0;
                        iVar103 = 0;
                        do {
                          iVar72 = *(int *)((long)local_448 + uVar96 * 4);
                          if (0 < iVar72) {
                            uVar87 = (ulong)(iVar72 - 1);
                            uVar85 = 0;
                            do {
                              iVar92 = (int)uVar87;
                              fVar124 = local_390[(long)iVar103 + (long)iVar92].y;
                              fVar112 = local_390[(long)iVar103 + uVar85].y;
                              if ((fVar124 != fVar112) || (NAN(fVar124) || NAN(fVar112))) {
                                iVar99 = (int)uVar85;
                                iVar82 = iVar92;
                                if (fVar124 <= fVar112) {
                                  iVar82 = iVar99;
                                  iVar99 = iVar92;
                                }
                                psVar79[(int)uVar91].invert = (uint)(fVar112 < fVar124);
                                sVar5 = local_390[(long)iVar103 + (long)iVar82];
                                sVar6 = local_390[(long)iVar103 + (long)iVar99];
                                psVar97 = psVar79 + (int)uVar91;
                                psVar97->x0 = sVar5.x * (float)local_78._0_4_ + 0.0;
                                psVar97->y0 = sVar5.y * (float)local_78._4_4_ + 0.0;
                                psVar97->x1 = sVar6.x * fStack_70 + 0.0;
                                psVar97->y1 = sVar6.y * fStack_6c + 0.0;
                                uVar91 = uVar91 + 1;
                              }
                              uVar87 = uVar85 & 0xffffffff;
                              uVar85 = uVar85 + 1;
                            } while ((long)uVar85 < (long)*(int *)((long)local_448 + uVar96 * 4));
                          }
                          iVar103 = iVar103 + iVar72;
                          uVar96 = uVar96 + 1;
                        } while (uVar96 != (uVar73 & 0xffffffff));
                      }
                      local_330 = psVar79;
                      stbtt__sort_edges_quicksort(psVar79,uVar91);
                      iVar103 = (int)local_3e0;
                      if (1 < (int)uVar91) {
                        uVar73 = 1;
                        do {
                          uVar2 = psVar79[uVar73].x0;
                          uVar7 = psVar79[uVar73].y0;
                          iVar72 = psVar79[uVar73].invert;
                          local_288[0].cursor = iVar72;
                          local_288[0].data = *(uchar **)&psVar79[uVar73].x1;
                          uVar96 = uVar73 & 0xffffffff;
                          do {
                            uVar189 = (uint)uVar96;
                            if ((int)uVar189 < 1) break;
                            fVar124 = psVar79[uVar96 - 1].y0;
                            if ((float)uVar7 < fVar124) {
                              psVar97 = psVar79 + uVar96;
                              psVar97->invert = psVar97[-1].invert;
                              fVar112 = psVar97[-1].y0;
                              fVar125 = psVar97[-1].x1;
                              fVar113 = psVar97[-1].y1;
                              psVar97->x0 = psVar97[-1].x0;
                              psVar97->y0 = fVar112;
                              psVar97->x1 = fVar125;
                              psVar97->y1 = fVar113;
                              uVar96 = (ulong)(uVar189 - 1);
                            }
                            uVar189 = (uint)uVar96;
                          } while ((float)uVar7 < fVar124);
                          if (uVar73 != uVar189) {
                            psVar79[(int)uVar189].x0 = (float)uVar2;
                            psVar79[(int)uVar189].y0 = (float)uVar7;
                            *(uchar **)&psVar79[(int)uVar189].x1 = local_288[0].data;
                            psVar79[(int)uVar189].invert = iVar72;
                          }
                          uVar73 = uVar73 + 1;
                        } while (uVar73 != uVar91);
                      }
                      uVar189 = (int)local_410 - (uint)local_3c8;
                      local_410 = (ulong)uVar189;
                      local_458._0_8_ = (stbtt__active_edge *)0x0;
                      scanline = local_288;
                      if (0x3f < (int)uVar189) {
                        scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_3fc * 8 + 4);
                        iVar103 = (int)local_3e0;
                        lVar106 = local_440;
                      }
                      uVar189 = (int)local_3a0 - iVar103;
                      local_3a0 = (ulong)uVar189;
                      psVar79[(int)uVar91].y0 = (float)(local_478._0_4_ + local_3c0) + 1.0;
                      if (uVar189 < 0x7fffffff) {
                        local_388 = local_398 + (long)local_388 * lVar106 + (ulong)uVar64;
                        local_368 = (float)(int)local_3f8._0_4_;
                        local_2e0 = (long)(int)local_3fc;
                        local_338 = (float *)((long)&scanline->data + local_2e0 * 4);
                        local_350 = local_338 + 1;
                        local_2d0 = local_2e0 * 4;
                        local_400 = (float)(int)local_3fc;
                        local_2d8 = (long)(int)(uint)local_410 * 4 + 8;
                        uVar73 = 0;
                        local_380 = 0;
                        local_3d0 = (undefined8 *)0x0;
                        local_434 = 0;
                        psVar104 = (stbtt__active_edge *)0x0;
                        iVar103 = local_3c0;
                        do {
                          fVar124 = (float)iVar103;
                          fVar112 = fVar124 + 1.0;
                          local_36c = iVar103;
                          local_2c8 = uVar73;
                          memset(scanline,0,local_2d0);
                          memset(local_338,0,local_2d8);
                          if ((stbtt__active_edge *)local_458._0_8_ != (stbtt__active_edge *)0x0) {
                            psVar89 = (stbtt__active_edge *)local_458._0_8_;
                            psVar108 = (stbtt__active_edge *)local_458;
                            do {
                              psVar107 = psVar89;
                              if (psVar89->ey <= fVar124) {
                                psVar108->next = psVar89->next;
                                if ((psVar89->direction == 0.0) && (!NAN(psVar89->direction))) {
                                  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                              ,0xc63,"stbtt__rasterize_sorted_edges",
                                              "ImGui ASSERT FAILED: %s","bool(z->direction)");
                                }
                                psVar89->direction = 0.0;
                                psVar89->next = psVar104;
                                psVar104 = psVar89;
                                psVar107 = psVar108;
                              }
                              psVar89 = psVar107->next;
                              psVar108 = psVar107;
                            } while (psVar89 != (stbtt__active_edge *)0x0);
                          }
                          fVar125 = psVar79->y0;
                          psVar89 = (stbtt__active_edge *)local_458._0_8_;
                          if (fVar125 <= fVar112) {
                            bVar63 = local_3c0 != 0;
                            bVar109 = (int)local_380 == 0;
                            do {
                              if ((fVar125 != psVar79->y1) || (NAN(fVar125) || NAN(psVar79->y1))) {
                                if (psVar104 == (stbtt__active_edge *)0x0) {
                                  psVar89 = psVar104;
                                  if (local_434 == 0) {
                                    puVar81 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                    if (puVar81 == (undefined8 *)0x0) {
                                      psVar108 = (stbtt__active_edge *)0x0;
                                      goto LAB_001cecdf;
                                    }
                                    *puVar81 = local_3d0;
                                    local_434 = 800;
                                    local_3d0 = puVar81;
                                  }
                                  lVar106 = (long)local_434;
                                  local_434 = local_434 + -1;
                                  psVar108 = (stbtt__active_edge *)(local_3d0 + lVar106 * 4 + -3);
                                }
                                else {
                                  psVar89 = psVar104->next;
                                  psVar108 = psVar104;
                                }
LAB_001cecdf:
                                psVar104 = psVar89;
                                if (psVar108 == (stbtt__active_edge *)0x0) {
                                  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                              ,0xad1,"stbtt__new_active","ImGui ASSERT FAILED: %s",
                                              "z != __null");
                                }
                                else {
                                  uVar3 = psVar79->x0;
                                  uVar8 = psVar79->y0;
                                  uVar4 = psVar79->x1;
                                  uVar9 = psVar79->y1;
                                  fVar125 = ((float)uVar4 - (float)uVar3) /
                                            ((float)uVar9 - (float)uVar8);
                                  psVar108->fdx = fVar125;
                                  psVar108->fdy =
                                       (float)(-(uint)(fVar125 != 0.0) & (uint)(1.0 / fVar125));
                                  psVar108->fx = ((fVar124 - (float)uVar8) * fVar125 + (float)uVar3)
                                                 - local_368;
                                  psVar108->direction =
                                       *(float *)(&DAT_0027e588 + (ulong)(psVar79->invert == 0) * 4)
                                  ;
                                  psVar108->sy = (float)uVar8;
                                  psVar108->ey = (float)uVar9;
                                  psVar108->next = (stbtt__active_edge *)0x0;
                                  if ((bVar109 && bVar63) &&
                                     (psVar108->ey <= fVar124 && fVar124 != psVar108->ey)) {
                                    psVar108->ey = fVar124;
                                  }
                                  if (psVar108->ey < fVar124) {
                                    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                                ,0xc76,"stbtt__rasterize_sorted_edges",
                                                "ImGui ASSERT FAILED: %s","z->ey >= scan_y_top");
                                  }
                                  psVar108->next = (stbtt__active_edge *)local_458._0_8_;
                                  local_458._0_8_ = psVar108;
                                }
                              }
                              fVar125 = psVar79[1].y0;
                              psVar79 = psVar79 + 1;
                              psVar89 = (stbtt__active_edge *)local_458._0_8_;
                            } while (fVar125 <= fVar112);
                          }
                          for (; psVar89 != (stbtt__active_edge *)0x0; psVar89 = psVar89->next) {
                            if (psVar89->ey < fVar124) {
                              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                          ,0xba5,"stbtt__fill_active_edges_new",
                                          "ImGui ASSERT FAILED: %s","e->ey >= y_top");
                            }
                            fVar125 = psVar89->fx;
                            local_478 = ZEXT416((uint)fVar125);
                            fVar113 = psVar89->fdx;
                            if ((fVar113 != 0.0) || (NAN(fVar113))) {
                              local_458._12_4_ = fVar113;
                              local_3f8 = ZEXT416((uint)psVar89->fdy);
                              if ((fVar112 < psVar89->sy) || (psVar89->ey < fVar124)) {
                                LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                            ,3000,"stbtt__fill_active_edges_new",
                                            "ImGui ASSERT FAILED: %s",
                                            "e->sy <= y_bottom && e->ey >= y_top");
                              }
                              fVar113 = (float)local_458._12_4_ + (float)local_478._0_4_;
                              fVar125 = psVar89->sy;
                              fVar132 = (float)(~-(uint)(fVar124 < fVar125) & local_478._0_4_ |
                                               (uint)((fVar125 - fVar124) * (float)local_458._12_4_
                                                     + (float)local_478._0_4_) &
                                               -(uint)(fVar124 < fVar125));
                              if (0.0 <= fVar132) {
                                fVar135 = psVar89->ey;
                                local_498._0_4_ = fVar135;
                                fVar138 = (float)(~-(uint)(fVar135 < fVar112) & (uint)fVar113 |
                                                 (uint)((fVar135 - fVar124) *
                                                        (float)local_458._12_4_ +
                                                       (float)local_478._0_4_) &
                                                 -(uint)(fVar135 < fVar112));
                                if (((0.0 <= fVar138) && (fVar132 < local_400)) &&
                                   (fVar138 < local_400)) {
                                  if (fVar125 <= fVar124) {
                                    fVar125 = fVar124;
                                  }
                                  iVar103 = (int)fVar132;
                                  if (fVar112 <= fVar135) {
                                    fVar135 = fVar112;
                                  }
                                  local_498._0_4_ = fVar135;
                                  if (iVar103 == (int)fVar138) {
                                    local_478 = ZEXT416((uint)fVar138);
                                    if ((iVar103 < 0) || ((int)(uint)local_410 < iVar103)) {
                                      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                                  ,0xbd4,"stbtt__fill_active_edges_new",
                                                  "ImGui ASSERT FAILED: %s","x >= 0 && x < len");
                                    }
                                    lVar106 = (long)iVar103;
                                    *(float *)((long)&scanline->data + lVar106 * 4) =
                                         ((((float)local_478._0_4_ - (float)iVar103) +
                                          (fVar132 - (float)iVar103)) * -0.5 + 1.0) *
                                         psVar89->direction * (fVar135 - fVar125) +
                                         *(float *)((long)&scanline->data + lVar106 * 4);
                                    fVar125 = (fVar135 - fVar125) * psVar89->direction;
                                  }
                                  else {
                                    fVar114 = (float)local_478._0_4_;
                                    fVar145 = fVar132;
                                    if (fVar138 < fVar132) {
                                      fVar114 = fVar124 - fVar125;
                                      fVar125 = (fVar124 - fVar135) + fVar112;
                                      local_3f8._0_4_ = -(float)local_3f8._0_4_;
                                      local_3f8._4_4_ = local_3f8._4_4_ ^ 0x80000000;
                                      local_3f8._8_4_ = local_3f8._8_4_ ^ 0x80000000;
                                      local_3f8._12_4_ = local_3f8._12_4_ ^ 0x80000000;
                                      local_498._0_4_ = fVar114 + fVar112;
                                      fVar114 = fVar113;
                                      fVar145 = fVar138;
                                      fVar138 = fVar132;
                                    }
                                    iVar72 = (int)fVar138;
                                    iVar103 = (int)fVar145 + 1;
                                    local_458._12_4_ =
                                         ((float)iVar103 - fVar114) * (float)local_3f8._0_4_ +
                                         fVar124;
                                    fVar113 = psVar89->direction;
                                    fVar132 = ((float)local_458._12_4_ - fVar125) * fVar113;
                                    local_3b8 = ZEXT416((uint)fVar132);
                                    lVar106 = (long)(int)fVar145;
                                    *(float *)((long)&scanline->data + lVar106 * 4) =
                                         (((fVar145 - (float)(int)fVar145) + 1.0) * -0.5 + 1.0) *
                                         fVar132 + *(float *)((long)&scanline->data + lVar106 * 4);
                                    local_478._0_4_ = fVar113;
                                    if (iVar72 - iVar103 != 0 && iVar103 <= iVar72) {
                                      do {
                                        *(float *)((long)&scanline->data + lVar106 * 4 + 4) =
                                             (float)local_3f8._0_4_ * fVar113 * 0.5 +
                                             local_3b8._0_4_ +
                                             *(float *)((long)&scanline->data + lVar106 * 4 + 4);
                                        local_3b8._0_4_ =
                                             local_3b8._0_4_ + (float)local_3f8._0_4_ * fVar113;
                                        lVar106 = lVar106 + 1;
                                      } while (iVar72 + -1 != (int)lVar106);
                                    }
                                    if (1.01 < ABS(local_3b8._0_4_)) {
                                      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                                  ,0xbfb,"stbtt__fill_active_edges_new",
                                                  "ImGui ASSERT FAILED: %s","fabsf(area) <= 1.01f");
                                    }
                                    lVar106 = (long)iVar72;
                                    *(float *)((long)&scanline->data + lVar106 * 4) =
                                         ((float)local_498._0_4_ -
                                         ((float)local_3f8._0_4_ * (float)(iVar72 - iVar103) +
                                         (float)local_458._12_4_)) *
                                         (((fVar138 - (float)iVar72) + 0.0) * -0.5 + 1.0) *
                                         (float)local_478._0_4_ + (float)local_3b8._0_4_ +
                                         *(float *)((long)&scanline->data + lVar106 * 4);
                                    fVar125 = ((float)local_498._0_4_ - fVar125) *
                                              (float)local_478._0_4_;
                                  }
                                  local_350[lVar106] = fVar125 + local_350[lVar106];
                                  goto LAB_001ceb60;
                                }
                              }
                              if ((uint)local_410 < 0x7fffffff) {
                                uVar91 = 0;
                                do {
                                  fVar125 = (float)(int)uVar91;
                                  uVar189 = uVar91 + 1;
                                  fVar138 = (float)(int)uVar189;
                                  local_498 = ZEXT416((uint)fVar138);
                                  fVar132 = (fVar125 - (float)local_478._0_4_) /
                                            (float)local_458._12_4_ + fVar124;
                                  local_3f8 = ZEXT416((uint)fVar132);
                                  fVar135 = (fVar138 - (float)local_478._0_4_) /
                                            (float)local_458._12_4_ + fVar124;
                                  local_3b8 = ZEXT416((uint)fVar135);
                                  if ((fVar125 <= (float)local_478._0_4_) || (fVar113 <= fVar138)) {
                                    if ((fVar125 <= fVar113) || ((float)local_478._0_4_ <= fVar138))
                                    {
                                      fVar135 = fVar124;
                                      fVar114 = (float)local_478._0_4_;
                                      if ((fVar113 <= fVar125 || fVar125 <= (float)local_478._0_4_)
                                         && ((float)local_478._0_4_ <= fVar125 || fVar125 <= fVar113
                                            )) {
                                        auVar126 = ZEXT416((uint)fVar124);
                                        fVar125 = (float)local_478._0_4_;
                                        if ((fVar138 < fVar113 && (float)local_478._0_4_ < fVar138)
                                           || (auVar126 = ZEXT416((uint)fVar124),
                                              fVar138 < (float)local_478._0_4_ && fVar113 < fVar138)
                                           ) goto LAB_001ce7b3;
                                        goto LAB_001ce91f;
                                      }
                                    }
                                    else {
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar91,psVar89,
                                                 (float)local_478._0_4_,fVar124,fVar138,fVar135);
                                      fVar135 = (float)local_3b8._0_4_;
                                      fVar132 = (float)local_3f8._0_4_;
                                      fVar114 = fVar138;
                                    }
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar91,psVar89,fVar114,fVar135,
                                               fVar125,fVar132);
                                    auVar126 = local_3f8;
                                  }
                                  else {
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar91,psVar89,
                                               (float)local_478._0_4_,fVar124,fVar125,fVar132);
                                    auVar126 = local_3f8;
LAB_001ce7b3:
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar91,psVar89,fVar125,
                                               auVar126._0_4_,fVar138,(float)local_3b8._0_4_);
                                    auVar126 = local_3b8;
                                    fVar125 = fVar138;
                                  }
LAB_001ce91f:
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,uVar91,psVar89,fVar125,auVar126._0_4_
                                             ,fVar113,fVar112);
                                  uVar91 = uVar189;
                                } while (local_3fc != uVar189);
                              }
                            }
                            else if (fVar125 < local_400) {
                              iVar103 = 0;
                              if (0.0 <= fVar125) {
                                stbtt__handle_clipped_edge
                                          ((float *)scanline,(int)fVar125,psVar89,fVar125,fVar124,
                                           fVar125,fVar112);
                                iVar103 = (int)fVar125 + 1;
                                fVar125 = (float)local_478._0_4_;
                              }
                              stbtt__handle_clipped_edge
                                        (local_338,iVar103,psVar89,fVar125,fVar124,fVar125,fVar112);
                            }
LAB_001ceb60:
                          }
                          psVar89 = (stbtt__active_edge *)local_458._0_8_;
                          if ((uint)local_410 < 0x7fffffff) {
                            fVar124 = 0.0;
                            uVar73 = local_2c8 & 0xffffffff;
                            psVar80 = scanline;
                            lVar106 = local_2e0;
                            do {
                              fVar124 = fVar124 + *(float *)((long)&psVar80->data + local_2e0 * 4);
                              iVar103 = (int)(ABS(*(float *)&psVar80->data + fVar124) * 255.0 + 0.5)
                              ;
                              uVar95 = (uchar)iVar103;
                              if (0xfe < iVar103) {
                                uVar95 = 0xff;
                              }
                              local_388[(int)uVar73] = uVar95;
                              uVar73 = (ulong)((int)uVar73 + 1);
                              psVar80 = (stbtt__buf *)((long)&psVar80->data + 4);
                              lVar106 = lVar106 + -1;
                            } while (lVar106 != 0);
                          }
                          for (; psVar89 != (stbtt__active_edge *)0x0; psVar89 = psVar89->next) {
                            psVar89->fx = psVar89->fdx + psVar89->fx;
                          }
                          iVar103 = local_36c + 1;
                          iVar72 = (int)local_380;
                          local_380 = (ulong)(iVar72 + 1);
                          uVar73 = (ulong)(uint)((int)local_2c8 + local_458._8_4_);
                          puVar81 = local_3d0;
                          psVar97 = local_330;
                        } while (iVar72 != (int)local_3a0);
                      }
                      else {
                        local_3d0 = (undefined8 *)0x0;
                        puVar81 = local_3d0;
                        psVar97 = local_330;
                      }
                      while (psVar79 = local_330, local_330 = psVar97, puVar81 != (undefined8 *)0x0)
                      {
                        puVar19 = (undefined8 *)*puVar81;
                        ImGui::MemFree(puVar81);
                        puVar81 = puVar19;
                        psVar97 = local_330;
                        local_330 = psVar79;
                      }
                      if (scanline != local_288) {
                        ImGui::MemFree(scanline);
                      }
                      ImGui::MemFree(psVar79);
                    }
                    ImGui::MemFree(local_448);
                    ImGui::MemFree(local_390);
                  }
                }
              }
              ImGui::MemFree((void *)CONCAT44(local_408._4_4_,(stbtt_uint32)local_408));
              if (1 < (byte)local_340) {
                uVar189 = (uint)*(ushort *)(local_3d8 + 4);
                local_288[0].data = (uchar *)0x0;
                uVar91 = (uint)*(ushort *)(local_3d8 + 6);
                if (uVar91 != 0) {
                  puVar78 = local_398 +
                            (ulong)*(ushort *)(local_3d8 + 10) * local_440 +
                            (ulong)*(ushort *)(local_3d8 + 8);
                  iVar103 = uVar189 - (uint)local_3c8;
                  uVar73 = (ulong)(iVar103 + 1);
                  uVar105 = 0;
                  do {
                    uVar96 = local_340;
                    memset(local_288,0,local_340);
                    switch((int)uVar96) {
                    case 2:
                      if (iVar103 < 0) {
LAB_001cf0cb:
                        uVar96 = 0;
                        uVar85 = 0;
                      }
                      else {
                        uVar96 = 0;
                        uVar85 = 0;
                        do {
                          bVar110 = puVar78[uVar96];
                          bVar116 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar96 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar96 + 2 & 7)) =
                               bVar110;
                          uVar101 = (int)uVar85 + ((uint)bVar110 - (uint)bVar116);
                          uVar85 = (ulong)uVar101;
                          puVar78[uVar96] = (uchar)(uVar101 >> 1);
                          uVar96 = uVar96 + 1;
                        } while (uVar73 != uVar96);
                      }
                      break;
                    case 3:
                      if (iVar103 < 0) goto LAB_001cf0cb;
                      uVar96 = 0;
                      uVar85 = 0;
                      do {
                        bVar110 = puVar78[uVar96];
                        bVar116 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar96 & 7));
                        *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar96 + 3 & 7)) =
                             bVar110;
                        uVar85 = (ulong)((int)uVar85 + ((uint)bVar110 - (uint)bVar116));
                        puVar78[uVar96] = (uchar)(uVar85 / 3);
                        uVar96 = uVar96 + 1;
                      } while (uVar73 != uVar96);
                      break;
                    case 4:
                      if (iVar103 < 0) goto LAB_001cf0cb;
                      uVar96 = 0;
                      uVar85 = 0;
                      do {
                        bVar110 = puVar78[uVar96];
                        uVar87 = (ulong)((uint)uVar96 & 7);
                        bVar116 = *(byte *)((long)&local_288[0].data + uVar87);
                        *(byte *)((long)&local_288[0].data + (uVar87 ^ 4)) = bVar110;
                        uVar101 = (int)uVar85 + ((uint)bVar110 - (uint)bVar116);
                        uVar85 = (ulong)uVar101;
                        puVar78[uVar96] = (uchar)(uVar101 >> 2);
                        uVar96 = uVar96 + 1;
                      } while (uVar73 != uVar96);
                      break;
                    case 5:
                      if (iVar103 < 0) goto LAB_001cf0cb;
                      uVar96 = 0;
                      uVar85 = 0;
                      do {
                        bVar110 = puVar78[uVar96];
                        bVar116 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar96 & 7));
                        *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar96 + 5 & 7)) =
                             bVar110;
                        uVar85 = (ulong)((int)uVar85 + ((uint)bVar110 - (uint)bVar116));
                        puVar78[uVar96] = (uchar)(uVar85 / 5);
                        uVar96 = uVar96 + 1;
                      } while (uVar73 != uVar96);
                      break;
                    default:
                      if (iVar103 < 0) goto LAB_001cf0cb;
                      uVar96 = 0;
                      uVar85 = 0;
                      do {
                        bVar110 = puVar78[uVar96];
                        bVar116 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar96 & 7));
                        *(byte *)((long)&local_288[0].data +
                                 (ulong)((int)local_3c8 + (uint)uVar96 & 7)) = bVar110;
                        uVar85 = (ulong)((int)uVar85 + ((uint)bVar110 - (uint)bVar116));
                        puVar78[uVar96] = (uchar)(uVar85 / (local_3c8 & 0xffffffff));
                        uVar96 = uVar96 + 1;
                      } while (uVar73 != uVar96);
                    }
                    if ((int)uVar96 < (int)uVar189) {
                      uVar96 = uVar96 & 0xffffffff;
                      do {
                        if (puVar78[uVar96] != '\0') {
                          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                      ,0xf41,"stbtt__h_prefilter","ImGui ASSERT FAILED: %s",
                                      "pixels[i] == 0");
                        }
                        uVar101 = (int)uVar85 -
                                  (uint)*(byte *)((long)&local_288[0].data +
                                                 (ulong)((uint)uVar96 & 7));
                        uVar85 = (ulong)uVar101;
                        puVar78[uVar96] = (uchar)(uVar101 / (uint)local_3c8);
                        uVar96 = uVar96 + 1;
                      } while ((int)uVar96 < (int)uVar189);
                    }
                    puVar78 = puVar78 + local_440;
                    uVar105 = uVar105 + 1;
                  } while (uVar105 != uVar91);
                }
              }
              if (1 < (byte)local_348) {
                uVar91 = (uint)*(ushort *)(local_3d8 + 6);
                local_288[0].data = (uchar *)0x0;
                uVar189 = CONCAT22(0,*(ushort *)(local_3d8 + 4));
                local_498._0_4_ = uVar189;
                if (uVar189 != 0) {
                  pbVar94 = local_398 +
                            (ulong)*(ushort *)(local_3d8 + 10) * local_440 +
                            (ulong)*(ushort *)(local_3d8 + 8);
                  iVar103 = uVar91 - (int)local_3e0;
                  uVar73 = (ulong)(iVar103 + 1);
                  uVar105 = 0;
                  do {
                    uVar85 = local_348;
                    uVar96 = local_3e0;
                    lVar106 = local_440;
                    memset(local_288,0,local_348);
                    switch((int)uVar85) {
                    case 2:
                      if (-1 < iVar103) {
                        uVar85 = 0;
                        uVar87 = 0;
                        pbVar98 = pbVar94;
                        do {
                          bVar110 = *pbVar98;
                          bVar116 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 + 2 & 7)) =
                               bVar110;
                          uVar101 = (int)uVar87 + ((uint)bVar110 - (uint)bVar116);
                          uVar87 = (ulong)uVar101;
                          *pbVar98 = (byte)(uVar101 >> 1);
                          uVar85 = uVar85 + 1;
                          pbVar98 = pbVar98 + lVar106;
                        } while (uVar73 != uVar85);
                        break;
                      }
LAB_001cf379:
                      iVar72 = 0;
                      uVar87 = 0;
                      goto LAB_001cf380;
                    case 3:
                      if (iVar103 < 0) goto LAB_001cf379;
                      uVar85 = 0;
                      uVar87 = 0;
                      pbVar98 = pbVar94;
                      do {
                        bVar110 = *pbVar98;
                        bVar116 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 & 7));
                        *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 + 3 & 7)) =
                             bVar110;
                        uVar87 = (ulong)((int)uVar87 + ((uint)bVar110 - (uint)bVar116));
                        *pbVar98 = (byte)(uVar87 / 3);
                        uVar85 = uVar85 + 1;
                        pbVar98 = pbVar98 + lVar106;
                      } while (uVar73 != uVar85);
                      break;
                    case 4:
                      if (iVar103 < 0) goto LAB_001cf379;
                      uVar85 = 0;
                      uVar87 = 0;
                      pbVar98 = pbVar94;
                      do {
                        bVar110 = *pbVar98;
                        uVar96 = (ulong)((uint)uVar85 & 7);
                        bVar116 = *(byte *)((long)&local_288[0].data + uVar96);
                        *(byte *)((long)&local_288[0].data + (uVar96 ^ 4)) = bVar110;
                        uVar101 = (int)uVar87 + ((uint)bVar110 - (uint)bVar116);
                        uVar87 = (ulong)uVar101;
                        *pbVar98 = (byte)(uVar101 >> 2);
                        uVar85 = uVar85 + 1;
                        pbVar98 = pbVar98 + lVar106;
                      } while (uVar73 != uVar85);
                      break;
                    case 5:
                      if (iVar103 < 0) goto LAB_001cf379;
                      uVar85 = 0;
                      uVar87 = 0;
                      pbVar98 = pbVar94;
                      do {
                        bVar110 = *pbVar98;
                        bVar116 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 & 7));
                        *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 + 5 & 7)) =
                             bVar110;
                        uVar87 = (ulong)((int)uVar87 + ((uint)bVar110 - (uint)bVar116));
                        *pbVar98 = (byte)(uVar87 / 5);
                        uVar85 = uVar85 + 1;
                        pbVar98 = pbVar98 + lVar106;
                      } while (uVar73 != uVar85);
                      break;
                    default:
                      if (iVar103 < 0) goto LAB_001cf379;
                      uVar85 = 0;
                      uVar87 = 0;
                      pbVar98 = pbVar94;
                      do {
                        bVar110 = *pbVar98;
                        bVar116 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 & 7));
                        *(byte *)((long)&local_288[0].data + (ulong)((int)uVar96 + (uint)uVar85 & 7)
                                 ) = bVar110;
                        uVar87 = (ulong)((int)uVar87 + ((uint)bVar110 - (uint)bVar116));
                        *pbVar98 = (byte)(uVar87 / (uVar96 & 0xffffffff));
                        uVar85 = uVar85 + 1;
                        pbVar98 = pbVar98 + lVar106;
                      } while (uVar73 != uVar85);
                    }
                    iVar72 = (int)uVar85;
LAB_001cf380:
                    iVar92 = uVar91 - iVar72;
                    if (iVar92 != 0 && iVar72 <= (int)uVar91) {
                      lVar106 = (long)iVar72;
                      pbVar98 = pbVar94 + local_440 * lVar106;
                      do {
                        if (*pbVar98 != 0) {
                          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                      ,0xf7f,"stbtt__v_prefilter","ImGui ASSERT FAILED: %s",
                                      "pixels[i*stride_in_bytes] == 0");
                        }
                        uVar101 = (int)uVar87 -
                                  (uint)*(byte *)((long)&local_288[0].data +
                                                 (ulong)((uint)lVar106 & 7));
                        uVar87 = (ulong)uVar101;
                        *pbVar98 = (byte)(uVar101 / (uint)local_3e0);
                        lVar106 = lVar106 + 1;
                        pbVar98 = pbVar98 + local_440;
                        iVar92 = iVar92 + -1;
                      } while (iVar92 != 0);
                    }
                    pbVar94 = pbVar94 + 1;
                    uVar105 = uVar105 + 1;
                  } while (uVar105 != uVar189);
                }
              }
              local_2f0[4] = (float)(int)(short)((short)(local_370 << 8) + (short)local_374) *
                             (float)local_328._0_4_;
              *(ulong *)(local_2f0 + 2) =
                   CONCAT44((float)local_364 * local_58._4_4_ + local_48._4_4_,
                            (float)local_360 * local_58._0_4_ + local_48._0_4_);
              uVar147 = *(undefined4 *)(local_3d8 + 8);
              *local_2f0 = uVar147;
              uVar91 = *(uint *)(local_3d8 + 4);
              sVar111 = (short)(uVar91 >> 0x10);
              local_2f0[1] = CONCAT22((short)((uint)uVar147 >> 0x10) + sVar111,
                                      (short)uVar147 + (short)uVar91);
              auVar129._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
              auVar129._4_2_ = sVar111;
              auVar129._0_4_ = uVar91;
              local_2f0[5] = (float)(int)((uVar91 & 0xffff) + local_360) * local_58._0_4_ +
                             local_48._0_4_;
              local_2f0[6] = (float)(auVar129._4_4_ + local_364) * local_58._4_4_ + local_48._4_4_;
              lVar75 = local_300;
              psVar93 = local_3a8;
              lVar102 = local_2e8;
              lVar106 = local_2f8;
              auVar133 = local_48;
            }
            lVar102 = lVar102 + 1;
          } while (lVar102 < psVar93[1].fontstart);
        }
        fVar124 = local_308[lVar106].RasterizerMultiply;
        if ((fVar124 != 1.0) || (NAN(fVar124))) {
          lVar75 = 0;
          auVar128 = _DAT_00276b40;
          auVar130 = _DAT_0027e450;
          auVar134 = _DAT_0027e440;
          auVar137 = _DAT_0027e430;
          do {
            auVar126 = auVar130 & _DAT_0027e460 | _DAT_0027e470;
            uVar91 = auVar130._4_4_;
            uVar189 = auVar130._8_4_;
            uVar105 = auVar130._12_4_;
            auVar152 = auVar128 & _DAT_0027e460 | _DAT_0027e470;
            uVar101 = auVar128._4_4_;
            uVar143 = auVar128._8_4_;
            uVar144 = auVar128._12_4_;
            auVar162 = auVar137 & _DAT_0027e460 | _DAT_0027e470;
            uVar155 = auVar137._4_4_;
            uVar157 = auVar137._8_4_;
            uVar159 = auVar137._12_4_;
            auVar177 = auVar134 & _DAT_0027e460 | _DAT_0027e470;
            uVar166 = auVar134._4_4_;
            uVar168 = auVar134._8_4_;
            uVar170 = auVar134._12_4_;
            fVar161 = (((float)(auVar134._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar177._0_4_) * fVar124;
            fVar167 = (((float)(uVar166 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar177._4_4_) *
                      fVar124;
            fVar169 = (((float)(uVar168 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar177._8_4_) *
                      fVar124;
            fVar171 = (((float)(uVar170 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar177._12_4_) *
                      fVar124;
            fVar146 = (((float)(auVar137._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar162._0_4_) * fVar124;
            fVar156 = (((float)(uVar155 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar162._4_4_) *
                      fVar124;
            fVar158 = (((float)(uVar157 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar162._8_4_) *
                      fVar124;
            fVar160 = (((float)(uVar159 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar162._12_4_) *
                      fVar124;
            fVar135 = (((float)(auVar128._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar152._0_4_) * fVar124;
            fVar138 = (((float)(uVar101 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar152._4_4_) *
                      fVar124;
            fVar114 = (((float)(uVar143 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar152._8_4_) *
                      fVar124;
            fVar145 = (((float)(uVar144 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar152._12_4_) *
                      fVar124;
            fVar112 = (((float)(auVar130._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar126._0_4_) * fVar124;
            fVar125 = (((float)(uVar91 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar126._4_4_) *
                      fVar124;
            fVar113 = (((float)(uVar189 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar126._8_4_) *
                      fVar124;
            fVar132 = (((float)(uVar105 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar126._12_4_) *
                      fVar124;
            auVar140._0_4_ = (int)fVar112;
            auVar140._4_4_ = (int)fVar125;
            auVar140._8_4_ = (int)fVar113;
            auVar140._12_4_ = (int)fVar132;
            auVar183._0_4_ = auVar140._0_4_ >> 0x1f;
            auVar183._4_4_ = auVar140._4_4_ >> 0x1f;
            auVar183._8_4_ = auVar140._8_4_ >> 0x1f;
            auVar183._12_4_ = auVar140._12_4_ >> 0x1f;
            auVar139._0_4_ = (int)(fVar112 - 2.1474836e+09);
            auVar139._4_4_ = (int)(fVar125 - 2.1474836e+09);
            auVar139._8_4_ = (int)(fVar113 - 2.1474836e+09);
            auVar139._12_4_ = (int)(fVar132 - 2.1474836e+09);
            auVar140 = auVar139 & auVar183 | auVar140;
            auVar142._0_4_ = (int)fVar135;
            auVar142._4_4_ = (int)fVar138;
            auVar142._8_4_ = (int)fVar114;
            auVar142._12_4_ = (int)fVar145;
            auVar184._0_4_ = auVar142._0_4_ >> 0x1f;
            auVar184._4_4_ = auVar142._4_4_ >> 0x1f;
            auVar184._8_4_ = auVar142._8_4_ >> 0x1f;
            auVar184._12_4_ = auVar142._12_4_ >> 0x1f;
            auVar141._0_4_ = (int)(fVar135 - 2.1474836e+09);
            auVar141._4_4_ = (int)(fVar138 - 2.1474836e+09);
            auVar141._8_4_ = (int)(fVar114 - 2.1474836e+09);
            auVar141._12_4_ = (int)(fVar145 - 2.1474836e+09);
            auVar142 = auVar141 & auVar184 | auVar142;
            auVar179._0_4_ = (int)fVar146;
            auVar179._4_4_ = (int)fVar156;
            auVar179._8_4_ = (int)fVar158;
            auVar179._12_4_ = (int)fVar160;
            auVar187._0_4_ = auVar179._0_4_ >> 0x1f;
            auVar187._4_4_ = auVar179._4_4_ >> 0x1f;
            auVar187._8_4_ = auVar179._8_4_ >> 0x1f;
            auVar187._12_4_ = auVar179._12_4_ >> 0x1f;
            auVar178._0_4_ = (int)(fVar146 - 2.1474836e+09);
            auVar178._4_4_ = (int)(fVar156 - 2.1474836e+09);
            auVar178._8_4_ = (int)(fVar158 - 2.1474836e+09);
            auVar178._12_4_ = (int)(fVar160 - 2.1474836e+09);
            auVar179 = auVar178 & auVar187 | auVar179;
            auVar164._0_4_ = (int)fVar161;
            auVar164._4_4_ = (int)fVar167;
            auVar164._8_4_ = (int)fVar169;
            auVar164._12_4_ = (int)fVar171;
            auVar185._0_4_ = auVar164._0_4_ >> 0x1f;
            auVar185._4_4_ = auVar164._4_4_ >> 0x1f;
            auVar185._8_4_ = auVar164._8_4_ >> 0x1f;
            auVar185._12_4_ = auVar164._12_4_ >> 0x1f;
            auVar163._0_4_ = (int)(fVar161 - 2.1474836e+09);
            auVar163._4_4_ = (int)(fVar167 - 2.1474836e+09);
            auVar163._8_4_ = (int)(fVar169 - 2.1474836e+09);
            auVar163._12_4_ = (int)(fVar171 - 2.1474836e+09);
            auVar164 = auVar163 & auVar185 | auVar164;
            auVar126 = auVar164 ^ _DAT_00249490;
            auVar153._0_4_ = -(uint)(auVar126._0_4_ < -0x7fffff01);
            auVar153._4_4_ = -(uint)(auVar126._4_4_ < -0x7fffff01);
            auVar153._8_4_ = -(uint)(auVar126._8_4_ < -0x7fffff01);
            auVar153._12_4_ = -(uint)(auVar126._12_4_ < -0x7fffff01);
            auVar126 = ~auVar153 & _DAT_0027e4c0 | auVar164 & auVar153;
            auVar152 = auVar179 ^ _DAT_00249490;
            auVar186._0_4_ = -(uint)(auVar152._0_4_ < -0x7fffff01);
            auVar186._4_4_ = -(uint)(auVar152._4_4_ < -0x7fffff01);
            auVar186._8_4_ = -(uint)(auVar152._8_4_ < -0x7fffff01);
            auVar186._12_4_ = -(uint)(auVar152._12_4_ < -0x7fffff01);
            auVar152 = ~auVar186 & _DAT_0027e4c0 | auVar179 & auVar186;
            sVar111 = auVar126._0_2_;
            cVar117 = (0 < sVar111) * (sVar111 < 0x100) * auVar126[0] - (0xff < sVar111);
            sVar111 = auVar126._2_2_;
            sVar119 = CONCAT11((0 < sVar111) * (sVar111 < 0x100) * auVar126[2] - (0xff < sVar111),
                               cVar117);
            sVar111 = auVar126._4_2_;
            cVar22 = (0 < sVar111) * (sVar111 < 0x100) * auVar126[4] - (0xff < sVar111);
            sVar111 = auVar126._6_2_;
            uVar147 = CONCAT13((0 < sVar111) * (sVar111 < 0x100) * auVar126[6] - (0xff < sVar111),
                               CONCAT12(cVar22,sVar119));
            sVar111 = auVar126._8_2_;
            cVar23 = (0 < sVar111) * (sVar111 < 0x100) * auVar126[8] - (0xff < sVar111);
            sVar111 = auVar126._10_2_;
            uVar148 = CONCAT15((0 < sVar111) * (sVar111 < 0x100) * auVar126[10] - (0xff < sVar111),
                               CONCAT14(cVar23,uVar147));
            sVar111 = auVar126._12_2_;
            cVar24 = (0 < sVar111) * (sVar111 < 0x100) * auVar126[0xc] - (0xff < sVar111);
            sVar111 = auVar126._14_2_;
            uVar149 = CONCAT17((0 < sVar111) * (sVar111 < 0x100) * auVar126[0xe] - (0xff < sVar111),
                               CONCAT16(cVar24,uVar148));
            sVar111 = auVar152._0_2_;
            cVar25 = (0 < sVar111) * (sVar111 < 0x100) * auVar152[0] - (0xff < sVar111);
            sVar111 = auVar152._2_2_;
            auVar150._0_10_ =
                 CONCAT19((0 < sVar111) * (sVar111 < 0x100) * auVar152[2] - (0xff < sVar111),
                          CONCAT18(cVar25,uVar149));
            sVar111 = auVar152._4_2_;
            cVar26 = (0 < sVar111) * (sVar111 < 0x100) * auVar152[4] - (0xff < sVar111);
            auVar150[10] = cVar26;
            sVar111 = auVar152._6_2_;
            auVar150[0xb] = (0 < sVar111) * (sVar111 < 0x100) * auVar152[6] - (0xff < sVar111);
            sVar111 = auVar152._8_2_;
            cVar27 = (0 < sVar111) * (sVar111 < 0x100) * auVar152[8] - (0xff < sVar111);
            auVar151[0xc] = cVar27;
            auVar151._0_12_ = auVar150;
            sVar111 = auVar152._10_2_;
            auVar151[0xd] = (0 < sVar111) * (sVar111 < 0x100) * auVar152[10] - (0xff < sVar111);
            sVar111 = auVar152._12_2_;
            cVar120 = (0 < sVar111) * (sVar111 < 0x100) * auVar152[0xc] - (0xff < sVar111);
            auVar154[0xe] = cVar120;
            auVar154._0_14_ = auVar151;
            sVar111 = auVar152._14_2_;
            auVar154[0xf] = (0 < sVar111) * (sVar111 < 0x100) * auVar152[0xe] - (0xff < sVar111);
            auVar126 = auVar142 ^ _DAT_00249490;
            auVar180._0_4_ = -(uint)(auVar126._0_4_ < -0x7fffff01);
            auVar180._4_4_ = -(uint)(auVar126._4_4_ < -0x7fffff01);
            auVar180._8_4_ = -(uint)(auVar126._8_4_ < -0x7fffff01);
            auVar180._12_4_ = -(uint)(auVar126._12_4_ < -0x7fffff01);
            auVar152 = ~auVar180 & _DAT_0027e4c0 | auVar142 & auVar180;
            auVar126 = auVar140 ^ _DAT_00249490;
            auVar165._0_4_ = -(uint)(auVar126._0_4_ < -0x7fffff01);
            auVar165._4_4_ = -(uint)(auVar126._4_4_ < -0x7fffff01);
            auVar165._8_4_ = -(uint)(auVar126._8_4_ < -0x7fffff01);
            auVar165._12_4_ = -(uint)(auVar126._12_4_ < -0x7fffff01);
            auVar126 = ~auVar165 & _DAT_0027e4c0 | auVar140 & auVar165;
            sVar111 = auVar152._0_2_;
            cVar28 = (0 < sVar111) * (sVar111 < 0x100) * auVar152[0] - (0xff < sVar111);
            sVar111 = auVar152._2_2_;
            sVar121 = CONCAT11((0 < sVar111) * (sVar111 < 0x100) * auVar152[2] - (0xff < sVar111),
                               cVar28);
            sVar111 = auVar152._4_2_;
            cVar29 = (0 < sVar111) * (sVar111 < 0x100) * auVar152[4] - (0xff < sVar111);
            sVar111 = auVar152._6_2_;
            uVar172 = CONCAT13((0 < sVar111) * (sVar111 < 0x100) * auVar152[6] - (0xff < sVar111),
                               CONCAT12(cVar29,sVar121));
            sVar111 = auVar152._8_2_;
            cVar30 = (0 < sVar111) * (sVar111 < 0x100) * auVar152[8] - (0xff < sVar111);
            sVar111 = auVar152._10_2_;
            uVar173 = CONCAT15((0 < sVar111) * (sVar111 < 0x100) * auVar152[10] - (0xff < sVar111),
                               CONCAT14(cVar30,uVar172));
            sVar111 = auVar152._12_2_;
            cVar31 = (0 < sVar111) * (sVar111 < 0x100) * auVar152[0xc] - (0xff < sVar111);
            sVar111 = auVar152._14_2_;
            uVar174 = CONCAT17((0 < sVar111) * (sVar111 < 0x100) * auVar152[0xe] - (0xff < sVar111),
                               CONCAT16(cVar31,uVar173));
            sVar111 = auVar126._0_2_;
            cVar32 = (0 < sVar111) * (sVar111 < 0x100) * auVar126[0] - (0xff < sVar111);
            sVar111 = auVar126._2_2_;
            auVar175._0_10_ =
                 CONCAT19((0 < sVar111) * (sVar111 < 0x100) * auVar126[2] - (0xff < sVar111),
                          CONCAT18(cVar32,uVar174));
            sVar111 = auVar126._4_2_;
            cVar33 = (0 < sVar111) * (sVar111 < 0x100) * auVar126[4] - (0xff < sVar111);
            auVar175[10] = cVar33;
            sVar111 = auVar126._6_2_;
            auVar175[0xb] = (0 < sVar111) * (sVar111 < 0x100) * auVar126[6] - (0xff < sVar111);
            sVar111 = auVar126._8_2_;
            cVar34 = (0 < sVar111) * (sVar111 < 0x100) * auVar126[8] - (0xff < sVar111);
            auVar176[0xc] = cVar34;
            auVar176._0_12_ = auVar175;
            sVar111 = auVar126._10_2_;
            auVar176[0xd] = (0 < sVar111) * (sVar111 < 0x100) * auVar126[10] - (0xff < sVar111);
            sVar111 = auVar126._12_2_;
            cVar35 = (0 < sVar111) * (sVar111 < 0x100) * auVar126[0xc] - (0xff < sVar111);
            auVar181[0xe] = cVar35;
            auVar181._0_14_ = auVar176;
            sVar111 = auVar126._14_2_;
            auVar181[0xf] = (0 < sVar111) * (sVar111 < 0x100) * auVar126[0xe] - (0xff < sVar111);
            sVar111 = (short)((uint)uVar172 >> 0x10);
            auVar182[1] = (0 < sVar111) * (sVar111 < 0x100) * cVar29 - (0xff < sVar111);
            auVar182[0] = (0 < sVar121) * (sVar121 < 0x100) * cVar28 - (0xff < sVar121);
            sVar111 = (short)((uint6)uVar173 >> 0x20);
            auVar182[2] = (0 < sVar111) * (sVar111 < 0x100) * cVar30 - (0xff < sVar111);
            sVar111 = (short)((ulong)uVar174 >> 0x30);
            auVar182[3] = (0 < sVar111) * (sVar111 < 0x100) * cVar31 - (0xff < sVar111);
            sVar111 = (short)((unkuint10)auVar175._0_10_ >> 0x40);
            auVar182[4] = (0 < sVar111) * (sVar111 < 0x100) * cVar32 - (0xff < sVar111);
            sVar111 = auVar175._10_2_;
            auVar182[5] = (0 < sVar111) * (sVar111 < 0x100) * cVar33 - (0xff < sVar111);
            sVar111 = auVar176._12_2_;
            auVar182[6] = (0 < sVar111) * (sVar111 < 0x100) * cVar34 - (0xff < sVar111);
            sVar111 = auVar181._14_2_;
            auVar182[7] = (0 < sVar111) * (sVar111 < 0x100) * cVar35 - (0xff < sVar111);
            auVar182[8] = (0 < sVar119) * (sVar119 < 0x100) * cVar117 - (0xff < sVar119);
            sVar111 = (short)((uint)uVar147 >> 0x10);
            auVar182[9] = (0 < sVar111) * (sVar111 < 0x100) * cVar22 - (0xff < sVar111);
            sVar111 = (short)((uint6)uVar148 >> 0x20);
            auVar182[10] = (0 < sVar111) * (sVar111 < 0x100) * cVar23 - (0xff < sVar111);
            sVar111 = (short)((ulong)uVar149 >> 0x30);
            auVar182[0xb] = (0 < sVar111) * (sVar111 < 0x100) * cVar24 - (0xff < sVar111);
            sVar111 = (short)((unkuint10)auVar150._0_10_ >> 0x40);
            auVar182[0xc] = (0 < sVar111) * (sVar111 < 0x100) * cVar25 - (0xff < sVar111);
            sVar111 = auVar150._10_2_;
            auVar182[0xd] = (0 < sVar111) * (sVar111 < 0x100) * cVar26 - (0xff < sVar111);
            sVar111 = auVar151._12_2_;
            auVar182[0xe] = (0 < sVar111) * (sVar111 < 0x100) * cVar27 - (0xff < sVar111);
            sVar111 = auVar154._14_2_;
            auVar182[0xf] = (0 < sVar111) * (sVar111 < 0x100) * cVar120 - (0xff < sVar111);
            *(undefined1 (*) [16])((long)&local_288[0].data + lVar75) = auVar182;
            lVar75 = lVar75 + 0x10;
            auVar128._0_4_ = auVar128._0_4_ + 0x10;
            auVar128._4_4_ = uVar101 + 0x10;
            auVar128._8_4_ = uVar143 + 0x10;
            auVar128._12_4_ = uVar144 + 0x10;
            auVar130._0_4_ = auVar130._0_4_ + 0x10;
            auVar130._4_4_ = uVar91 + 0x10;
            auVar130._8_4_ = uVar189 + 0x10;
            auVar130._12_4_ = uVar105 + 0x10;
            auVar134._0_4_ = auVar134._0_4_ + 0x10;
            auVar134._4_4_ = uVar166 + 0x10;
            auVar134._8_4_ = uVar168 + 0x10;
            auVar134._12_4_ = uVar170 + 0x10;
            auVar137._0_4_ = auVar137._0_4_ + 0x10;
            auVar137._4_4_ = uVar155 + 0x10;
            auVar137._8_4_ = uVar157 + 0x10;
            auVar137._12_4_ = uVar159 + 0x10;
          } while (lVar75 != 0x100);
          if (0 < psVar93[1].cff.cursor) {
            lVar102._0_4_ = psVar93[1].hmtx;
            lVar102._4_4_ = psVar93[1].kern;
            iVar103 = 0;
            do {
              if ((*(int *)(lVar102 + 0xc) != 0) && (*(ushort *)(lVar102 + 6) != 0)) {
                uVar64 = *(ushort *)(lVar102 + 4);
                iVar72 = atlas->TexWidth;
                puVar78 = atlas->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar102 + 10) * (long)iVar72 +
                          (ulong)*(ushort *)(lVar102 + 8);
                uVar91 = (uint)*(ushort *)(lVar102 + 6);
                do {
                  if ((ulong)uVar64 != 0) {
                    uVar73 = 0;
                    do {
                      puVar78[uVar73] =
                           *(uchar *)((long)&local_288[0].data + (ulong)puVar78[uVar73]);
                      uVar73 = uVar73 + 1;
                    } while (uVar64 != uVar73);
                  }
                  puVar78 = puVar78 + iVar72;
                  bVar63 = 1 < (int)uVar91;
                  uVar91 = uVar91 - 1;
                } while (bVar63);
              }
              iVar103 = iVar103 + 1;
              lVar102 = lVar102 + 0x10;
            } while (iVar103 < psVar93[1].cff.cursor);
          }
        }
        psVar93[1].hmtx = 0;
        psVar93[1].kern = 0;
      }
      lVar106 = lVar106 + 1;
    } while (lVar106 != lVar83);
  }
  ImGui::MemFree(local_418);
  ImGui::MemFree(local_358);
  uVar149 = local_468._8_8_;
  if ((void *)local_468._8_8_ != (void *)0x0) {
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_468._8_8_;
    local_468 = auVar54 << 0x40;
    ImGui::MemFree((void *)uVar149);
    local_468._8_8_ = 0;
  }
  if (0 < (int)uVar13) {
    sVar123 = DAT_0027e420._6_2_;
    sVar121 = DAT_0027e420._4_2_;
    sVar119 = DAT_0027e420._2_2_;
    sVar111 = (short)DAT_0027e420;
    lVar106 = 0;
    do {
      lVar75 = lVar106 * 0x110;
      if (*(int *)((long)local_4b8 + lVar75 + 0xe8) != 0) {
        if ((atlas->ConfigData).Size <= lVar106) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar20 = (atlas->ConfigData).Data;
        pIVar14 = pIVar20 + lVar106;
        pIVar15 = pIVar20[lVar106].DstFont;
        if (pIVar20[lVar106].MergeMode == false) {
          fVar124 = pIVar20[lVar106].SizePixels;
          lVar102 = *(long *)((long)local_4b8 + lVar75 + 8);
          lVar86 = (long)*(int *)((long)local_4b8 + lVar75 + 0x24);
          bVar110 = *(byte *)(lVar102 + 4 + lVar86);
          bVar116 = *(byte *)(lVar102 + 5 + lVar86);
          bVar10 = *(byte *)(lVar102 + 7 + lVar86);
          bVar11 = *(byte *)(lVar102 + 6 + lVar86);
          ImFont::ClearOutputData(pIVar15);
          iVar103 = (uint)bVar11 * 0x100 + (uint)bVar110;
          auVar44._1_9_ = (unkuint9)0 << 8;
          auVar44[0] = (char)((uint)iVar103 >> 0x10);
          auVar44._10_6_ = 0;
          auVar59._1_12_ = SUB1612(auVar44 << 0x28,4);
          auVar59[0] = (char)((uint)iVar103 >> 8);
          auVar59[0xd] = 0;
          auVar60._1_14_ = auVar59 << 8;
          auVar60[0] = (char)iVar103;
          auVar60[0xf] = 0;
          auVar126 = ZEXT416((uint)bVar116 | (uint)bVar10 << 0x10) | auVar60 << 8;
          sVar65 = auVar126._0_2_;
          sVar37 = auVar126._2_2_;
          fVar112 = (float)((int)sVar65 - (int)sVar37);
          sVar122 = auVar126._4_2_;
          auVar61._4_6_ = 0;
          auVar61._0_4_ = fVar112;
          auVar61._10_2_ = sVar122;
          auVar62._8_4_ = auVar61._8_4_;
          auVar62._6_2_ = sVar37;
          auVar62._4_2_ = (short)((uint)fVar112 >> 0x10);
          auVar62._0_4_ = fVar112;
          auVar131._0_2_ = -(ushort)(sVar65 < sVar111);
          auVar131._2_2_ = -(ushort)(sVar65 < sVar111);
          auVar131._4_2_ = -(ushort)(sVar37 < sVar119);
          auVar131._6_2_ = -(ushort)(sVar37 < sVar119);
          auVar131._8_2_ = -(ushort)(sVar122 < sVar121);
          auVar131._10_2_ = -(ushort)(sVar122 < sVar121);
          auVar131._12_2_ = -(ushort)(0 < sVar123);
          auVar131._14_2_ = -(ushort)(0 < sVar123);
          auVar126 = auVar131 & _DAT_0027e4e0 | ~auVar131 & _DAT_0024d380;
          pIVar15->FontSize = pIVar14->SizePixels;
          pIVar15->ConfigData = pIVar14;
          pIVar15->ContainerAtlas = atlas;
          pIVar15->Ascent = (float)(int)((fVar124 / fVar112) * (float)(int)sVar65 + auVar126._0_4_);
          pIVar15->Descent =
               (float)(int)((fVar124 / fVar112) * (float)(auVar62._4_4_ >> 0x10) + auVar126._4_4_);
        }
        pIVar15->ConfigDataCount = pIVar15->ConfigDataCount + 1;
        if (0 < *(int *)((long)local_4b8 + lVar75 + 0xe8)) {
          fVar124 = (pIVar14->GlyphOffset).x;
          fVar112 = (float)(int)(pIVar15->Ascent + 0.5) + (pIVar14->GlyphOffset).y;
          lVar86 = 0;
          lVar102 = 0;
          do {
            if (*(int *)((long)local_4b8 + lVar75 + 0x100) <= lVar102) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                          ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
            }
            lVar21 = *(long *)((long)local_4b8 + lVar75 + 0xd0);
            fVar125 = *(float *)(lVar21 + 0x10 + lVar86);
            fVar113 = pIVar14->GlyphMaxAdvanceX;
            if (fVar125 <= pIVar14->GlyphMaxAdvanceX) {
              fVar113 = fVar125;
            }
            uVar91 = -(uint)(fVar125 < pIVar14->GlyphMinAdvanceX);
            fVar113 = (float)(uVar91 & (uint)pIVar14->GlyphMinAdvanceX | ~uVar91 & (uint)fVar113);
            if ((fVar125 != fVar113) || (fVar132 = fVar124, NAN(fVar125) || NAN(fVar113))) {
              fVar132 = (fVar113 - fVar125) * 0.5;
              if (pIVar14->PixelSnapH != false) {
                fVar132 = (float)(int)fVar132;
              }
              fVar132 = fVar132 + fVar124;
            }
            fVar135 = 1.0 / (float)atlas->TexHeight;
            fVar125 = 1.0 / (float)atlas->TexWidth;
            ImFont::AddGlyph(pIVar15,(ImWchar)*(undefined4 *)
                                               (*(long *)((long)local_4b8 + lVar75 + 0x108) +
                                               lVar102 * 4),
                             *(float *)(lVar21 + 8 + lVar86) + 0.0 + fVar132,
                             *(float *)(lVar21 + 0xc + lVar86) + 0.0 + fVar112,
                             *(float *)(lVar21 + 0x14 + lVar86) + 0.0 + fVar132,
                             *(float *)(lVar21 + 0x18 + lVar86) + 0.0 + fVar112,
                             (float)*(ushort *)(lVar21 + lVar86) * fVar125,
                             (float)*(ushort *)(lVar21 + 2 + lVar86) * fVar135,
                             (float)*(ushort *)(lVar21 + 4 + lVar86) * fVar125,
                             (float)*(ushort *)(lVar21 + 6 + lVar86) * fVar135,fVar113);
            lVar102 = lVar102 + 1;
            lVar86 = lVar86 + 0x1c;
          } while (lVar102 < *(int *)((long)local_4b8 + lVar75 + 0xe8));
        }
      }
      lVar106 = lVar106 + 1;
    } while (lVar106 != lVar83);
  }
  if (0 < (int)uVar13) {
    sVar90 = 0;
    do {
      pvVar77 = *(void **)((long)local_4b8 + sVar90 + 0x108);
      if (pvVar77 != (void *)0x0) {
        ImGui::MemFree(pvVar77);
      }
      pvVar77 = *(void **)((long)local_4b8 + sVar90 + 0xf8);
      if (pvVar77 != (void *)0x0) {
        ImGui::MemFree(pvVar77);
      }
      sVar90 = sVar90 + 0x110;
    } while (local_310 != sVar90);
  }
  ImFontAtlasBuildFinish(atlas);
  if (pvStack_420 != (void *)0x0) {
    ImGui::MemFree(pvStack_420);
  }
  if ((void *)local_468._8_8_ != (void *)0x0) {
    ImGui::MemFree((void *)local_468._8_8_);
  }
LAB_001cfc30:
  if (local_430 != (void *)0x0) {
    ImGui::MemFree(local_430);
  }
  if (local_4b8 != (void *)0x0) {
    ImGui::MemFree(local_4b8);
  }
  return local_4d9;
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
        if (src_tmp.DstIndex == -1)
            return false;

        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];

            const float char_advance_x_org = pc.xadvance;
            const float char_advance_x_mod = ImClamp(char_advance_x_org, cfg.GlyphMinAdvanceX, cfg.GlyphMaxAdvanceX);
            float char_off_x = font_off_x;
            if (char_advance_x_org != char_advance_x_mod)
                char_off_x += cfg.PixelSnapH ? ImFloor((char_advance_x_mod - char_advance_x_org) * 0.5f) : (char_advance_x_mod - char_advance_x_org) * 0.5f;

            // Register glyph
            stbtt_aligned_quad q;
            float dummy_x = 0.0f, dummy_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &dummy_x, &dummy_y, &q, 0);
            dst_font->AddGlyph((ImWchar)codepoint, q.x0 + char_off_x, q.y0 + font_off_y, q.x1 + char_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, char_advance_x_mod);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}